

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_n<embree::avx512::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  byte bVar22;
  uint uVar23;
  ulong uVar24;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  bool bVar29;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar64 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar52 [16];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  float fVar92;
  undefined4 uVar93;
  float fVar98;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float t1;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  vfloat4 b0;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  vfloat4 b0_1;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  vfloat4 a0_3;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  vfloat4 a0_2;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar185;
  float fVar196;
  float fVar198;
  vfloat4 a0_1;
  float fVar200;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar197;
  float fVar199;
  float fVar201;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar213;
  float fVar214;
  vfloat4 a0;
  undefined1 auVar206 [16];
  float fVar215;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 in_ZMM17 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_32c;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  ulong local_300;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  ulong local_250;
  RTCFilterFunctionNArguments local_248;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  uint auStack_178 [4];
  undefined8 local_168;
  undefined4 local_160;
  undefined8 local_15c;
  undefined4 local_154;
  undefined4 local_150;
  uint local_14c;
  uint local_148;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined8 uStack_b8;
  undefined1 local_98 [32];
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong auStack_58 [5];
  ulong uVar25;
  undefined1 auVar63 [32];
  undefined1 auVar65 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar224 [32];
  
  PVar4 = prim[1];
  uVar30 = (ulong)(byte)PVar4;
  fVar204 = *(float *)(prim + uVar30 * 0x19 + 0x12);
  auVar74._16_16_ =
       vsubps_avx((undefined1  [16])(ray->org).field_0,
                  *(undefined1 (*) [16])(prim + uVar30 * 0x19 + 6));
  fVar109 = fVar204 * auVar74._16_4_;
  fVar92 = fVar204 * (ray->dir).field_0.m128[0];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar30 * 4 + 6);
  auVar61 = vpmovsxbd_avx2(auVar37);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar30 * 5 + 6);
  auVar59 = vpmovsxbd_avx2(auVar47);
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar30 * 6 + 6);
  auVar66 = vpmovsxbd_avx2(auVar46);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar30 * 0xb + 6);
  auVar76 = vpmovsxbd_avx2(auVar45);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar70 = vpmovsxbd_avx2(auVar44);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar77 = vcvtdq2ps_avx(auVar70);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar30 + 6);
  auVar60 = vpmovsxbd_avx2(auVar43);
  auVar60 = vcvtdq2ps_avx(auVar60);
  uVar32 = (ulong)(uint)((int)(uVar30 * 9) * 2);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar32 + 6);
  auVar67 = vpmovsxbd_avx2(auVar42);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar32 + uVar30 + 6);
  auVar68 = vpmovsxbd_avx2(auVar41);
  auVar68 = vcvtdq2ps_avx(auVar68);
  uVar24 = (ulong)(uint)((int)(uVar30 * 5) << 2);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar24 + 6);
  auVar58 = vpmovsxbd_avx2(auVar38);
  auVar69 = vcvtdq2ps_avx(auVar58);
  auVar219._4_4_ = fVar92;
  auVar219._0_4_ = fVar92;
  auVar219._8_4_ = fVar92;
  auVar219._12_4_ = fVar92;
  auVar219._16_4_ = fVar92;
  auVar219._20_4_ = fVar92;
  auVar219._24_4_ = fVar92;
  auVar219._28_4_ = fVar92;
  auVar230._8_4_ = 1;
  auVar230._0_8_ = 0x100000001;
  auVar230._12_4_ = 1;
  auVar230._16_4_ = 1;
  auVar230._20_4_ = 1;
  auVar230._24_4_ = 1;
  auVar230._28_4_ = 1;
  auVar56 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar72 = ZEXT1632(CONCAT412(fVar204 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar204 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar204 * (ray->dir).field_0.m128[1],fVar92))));
  auVar71 = vpermps_avx2(auVar230,auVar72);
  auVar57 = vpermps_avx512vl(auVar56,auVar72);
  fVar92 = auVar57._0_4_;
  fVar197 = auVar57._4_4_;
  auVar72._4_4_ = fVar197 * auVar66._4_4_;
  auVar72._0_4_ = fVar92 * auVar66._0_4_;
  fVar199 = auVar57._8_4_;
  auVar72._8_4_ = fVar199 * auVar66._8_4_;
  fVar201 = auVar57._12_4_;
  auVar72._12_4_ = fVar201 * auVar66._12_4_;
  fVar202 = auVar57._16_4_;
  auVar72._16_4_ = fVar202 * auVar66._16_4_;
  fVar203 = auVar57._20_4_;
  auVar72._20_4_ = fVar203 * auVar66._20_4_;
  fVar98 = auVar57._24_4_;
  auVar72._24_4_ = fVar98 * auVar66._24_4_;
  auVar72._28_4_ = auVar70._28_4_;
  auVar70._4_4_ = auVar60._4_4_ * fVar197;
  auVar70._0_4_ = auVar60._0_4_ * fVar92;
  auVar70._8_4_ = auVar60._8_4_ * fVar199;
  auVar70._12_4_ = auVar60._12_4_ * fVar201;
  auVar70._16_4_ = auVar60._16_4_ * fVar202;
  auVar70._20_4_ = auVar60._20_4_ * fVar203;
  auVar70._24_4_ = auVar60._24_4_ * fVar98;
  auVar70._28_4_ = auVar58._28_4_;
  auVar58._4_4_ = auVar69._4_4_ * fVar197;
  auVar58._0_4_ = auVar69._0_4_ * fVar92;
  auVar58._8_4_ = auVar69._8_4_ * fVar199;
  auVar58._12_4_ = auVar69._12_4_ * fVar201;
  auVar58._16_4_ = auVar69._16_4_ * fVar202;
  auVar58._20_4_ = auVar69._20_4_ * fVar203;
  auVar58._24_4_ = auVar69._24_4_ * fVar98;
  auVar58._28_4_ = auVar57._28_4_;
  auVar37 = vfmadd231ps_fma(auVar72,auVar71,auVar59);
  auVar47 = vfmadd231ps_fma(auVar70,auVar71,auVar77);
  auVar46 = vfmadd231ps_fma(auVar58,auVar68,auVar71);
  auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),auVar219,auVar61);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar219,auVar76);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar67,auVar219);
  auVar220._4_4_ = fVar109;
  auVar220._0_4_ = fVar109;
  auVar220._8_4_ = fVar109;
  auVar220._12_4_ = fVar109;
  auVar220._16_4_ = fVar109;
  auVar220._20_4_ = fVar109;
  auVar220._24_4_ = fVar109;
  auVar220._28_4_ = fVar109;
  auVar58 = ZEXT1632(CONCAT412(fVar204 * auVar74._28_4_,
                               CONCAT48(fVar204 * auVar74._24_4_,
                                        CONCAT44(fVar204 * auVar74._20_4_,fVar109))));
  auVar70 = vpermps_avx2(auVar230,auVar58);
  auVar58 = vpermps_avx512vl(auVar56,auVar58);
  fVar204 = auVar58._0_4_;
  fVar92 = auVar58._4_4_;
  auVar71._4_4_ = fVar92 * auVar66._4_4_;
  auVar71._0_4_ = fVar204 * auVar66._0_4_;
  fVar197 = auVar58._8_4_;
  auVar71._8_4_ = fVar197 * auVar66._8_4_;
  fVar199 = auVar58._12_4_;
  auVar71._12_4_ = fVar199 * auVar66._12_4_;
  fVar201 = auVar58._16_4_;
  auVar71._16_4_ = fVar201 * auVar66._16_4_;
  fVar202 = auVar58._20_4_;
  auVar71._20_4_ = fVar202 * auVar66._20_4_;
  fVar203 = auVar58._24_4_;
  auVar71._24_4_ = fVar203 * auVar66._24_4_;
  auVar71._28_4_ = 1;
  auVar56._4_4_ = auVar60._4_4_ * fVar92;
  auVar56._0_4_ = auVar60._0_4_ * fVar204;
  auVar56._8_4_ = auVar60._8_4_ * fVar197;
  auVar56._12_4_ = auVar60._12_4_ * fVar199;
  auVar56._16_4_ = auVar60._16_4_ * fVar201;
  auVar56._20_4_ = auVar60._20_4_ * fVar202;
  auVar56._24_4_ = auVar60._24_4_ * fVar203;
  auVar56._28_4_ = auVar66._28_4_;
  auVar60._4_4_ = auVar69._4_4_ * fVar92;
  auVar60._0_4_ = auVar69._0_4_ * fVar204;
  auVar60._8_4_ = auVar69._8_4_ * fVar197;
  auVar60._12_4_ = auVar69._12_4_ * fVar199;
  auVar60._16_4_ = auVar69._16_4_ * fVar201;
  auVar60._20_4_ = auVar69._20_4_ * fVar202;
  auVar60._24_4_ = auVar69._24_4_ * fVar203;
  auVar60._28_4_ = auVar58._28_4_;
  auVar45 = vfmadd231ps_fma(auVar71,auVar70,auVar59);
  auVar44 = vfmadd231ps_fma(auVar56,auVar70,auVar77);
  auVar43 = vfmadd231ps_fma(auVar60,auVar70,auVar68);
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar220,auVar61);
  auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar220,auVar76);
  auVar80._8_4_ = 0x7fffffff;
  auVar80._0_8_ = 0x7fffffff7fffffff;
  auVar80._12_4_ = 0x7fffffff;
  auVar80._16_4_ = 0x7fffffff;
  auVar80._20_4_ = 0x7fffffff;
  auVar80._24_4_ = 0x7fffffff;
  auVar80._28_4_ = 0x7fffffff;
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar220,auVar67);
  auVar61 = vandps_avx(ZEXT1632(auVar37),auVar80);
  auVar138._8_4_ = 0x219392ef;
  auVar138._0_8_ = 0x219392ef219392ef;
  auVar138._12_4_ = 0x219392ef;
  auVar138._16_4_ = 0x219392ef;
  auVar138._20_4_ = 0x219392ef;
  auVar138._24_4_ = 0x219392ef;
  auVar138._28_4_ = 0x219392ef;
  uVar32 = vcmpps_avx512vl(auVar61,auVar138,1);
  bVar29 = (bool)((byte)uVar32 & 1);
  auVar57._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar37._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar57._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar37._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar57._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar37._8_4_;
  bVar29 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar57._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar37._12_4_;
  auVar57._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * 0x219392ef;
  auVar57._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * 0x219392ef;
  auVar57._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * 0x219392ef;
  auVar57._28_4_ = (uint)(byte)(uVar32 >> 7) * 0x219392ef;
  auVar61 = vandps_avx(ZEXT1632(auVar47),auVar80);
  uVar32 = vcmpps_avx512vl(auVar61,auVar138,1);
  bVar29 = (bool)((byte)uVar32 & 1);
  auVar73._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar47._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar47._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar47._8_4_;
  bVar29 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar47._12_4_;
  auVar73._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * 0x219392ef;
  auVar73._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * 0x219392ef;
  auVar73._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * 0x219392ef;
  auVar73._28_4_ = (uint)(byte)(uVar32 >> 7) * 0x219392ef;
  auVar61 = vandps_avx(ZEXT1632(auVar46),auVar80);
  uVar32 = vcmpps_avx512vl(auVar61,auVar138,1);
  bVar29 = (bool)((byte)uVar32 & 1);
  auVar61._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar46._0_4_;
  bVar29 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar61._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar46._4_4_;
  bVar29 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar61._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar46._8_4_;
  bVar29 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar61._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar46._12_4_;
  auVar61._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * 0x219392ef;
  auVar61._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * 0x219392ef;
  auVar61._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * 0x219392ef;
  auVar61._28_4_ = (uint)(byte)(uVar32 >> 7) * 0x219392ef;
  auVar59 = vrcp14ps_avx512vl(auVar57);
  auVar125._8_4_ = 0x3f800000;
  auVar125._0_8_ = 0x3f8000003f800000;
  auVar125._12_4_ = 0x3f800000;
  auVar125._16_4_ = 0x3f800000;
  auVar125._20_4_ = 0x3f800000;
  auVar125._24_4_ = 0x3f800000;
  auVar125._28_4_ = 0x3f800000;
  auVar37 = vfnmadd213ps_fma(auVar57,auVar59,auVar125);
  auVar37 = vfmadd132ps_fma(ZEXT1632(auVar37),auVar59,auVar59);
  auVar59 = vrcp14ps_avx512vl(auVar73);
  auVar47 = vfnmadd213ps_fma(auVar73,auVar59,auVar125);
  auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar59,auVar59);
  auVar59 = vrcp14ps_avx512vl(auVar61);
  auVar46 = vfnmadd213ps_fma(auVar61,auVar59,auVar125);
  auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar59,auVar59);
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 7 + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar45));
  auVar67._4_4_ = auVar37._4_4_ * auVar61._4_4_;
  auVar67._0_4_ = auVar37._0_4_ * auVar61._0_4_;
  auVar67._8_4_ = auVar37._8_4_ * auVar61._8_4_;
  auVar67._12_4_ = auVar37._12_4_ * auVar61._12_4_;
  auVar67._16_4_ = auVar61._16_4_ * 0.0;
  auVar67._20_4_ = auVar61._20_4_ * 0.0;
  auVar67._24_4_ = auVar61._24_4_ * 0.0;
  auVar67._28_4_ = auVar61._28_4_;
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 9 + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar45));
  auVar60 = vpbroadcastd_avx512vl();
  auVar59 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar79._0_4_ = auVar37._0_4_ * auVar61._0_4_;
  auVar79._4_4_ = auVar37._4_4_ * auVar61._4_4_;
  auVar79._8_4_ = auVar37._8_4_ * auVar61._8_4_;
  auVar79._12_4_ = auVar37._12_4_ * auVar61._12_4_;
  auVar79._16_4_ = auVar61._16_4_ * 0.0;
  auVar79._20_4_ = auVar61._20_4_ * 0.0;
  auVar79._24_4_ = auVar61._24_4_ * 0.0;
  auVar79._28_4_ = 0;
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar30 * -2 + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar44));
  auVar68._4_4_ = auVar47._4_4_ * auVar61._4_4_;
  auVar68._0_4_ = auVar47._0_4_ * auVar61._0_4_;
  auVar68._8_4_ = auVar47._8_4_ * auVar61._8_4_;
  auVar68._12_4_ = auVar47._12_4_ * auVar61._12_4_;
  auVar68._16_4_ = auVar61._16_4_ * 0.0;
  auVar68._20_4_ = auVar61._20_4_ * 0.0;
  auVar68._24_4_ = auVar61._24_4_ * 0.0;
  auVar68._28_4_ = auVar61._28_4_;
  auVar61 = vcvtdq2ps_avx(auVar59);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar44));
  auVar78._0_4_ = auVar47._0_4_ * auVar61._0_4_;
  auVar78._4_4_ = auVar47._4_4_ * auVar61._4_4_;
  auVar78._8_4_ = auVar47._8_4_ * auVar61._8_4_;
  auVar78._12_4_ = auVar47._12_4_ * auVar61._12_4_;
  auVar78._16_4_ = auVar61._16_4_ * 0.0;
  auVar78._20_4_ = auVar61._20_4_ * 0.0;
  auVar78._24_4_ = auVar61._24_4_ * 0.0;
  auVar78._28_4_ = 0;
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar24 + uVar30 + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar43));
  auVar69._4_4_ = auVar61._4_4_ * auVar46._4_4_;
  auVar69._0_4_ = auVar61._0_4_ * auVar46._0_4_;
  auVar69._8_4_ = auVar61._8_4_ * auVar46._8_4_;
  auVar69._12_4_ = auVar61._12_4_ * auVar46._12_4_;
  auVar69._16_4_ = auVar61._16_4_ * 0.0;
  auVar69._20_4_ = auVar61._20_4_ * 0.0;
  auVar69._24_4_ = auVar61._24_4_ * 0.0;
  auVar69._28_4_ = auVar61._28_4_;
  auVar61 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 0x17 + 6));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar61 = vsubps_avx(auVar61,ZEXT1632(auVar43));
  auVar75._0_4_ = auVar46._0_4_ * auVar61._0_4_;
  auVar75._4_4_ = auVar46._4_4_ * auVar61._4_4_;
  auVar75._8_4_ = auVar46._8_4_ * auVar61._8_4_;
  auVar75._12_4_ = auVar46._12_4_ * auVar61._12_4_;
  auVar75._16_4_ = auVar61._16_4_ * 0.0;
  auVar75._20_4_ = auVar61._20_4_ * 0.0;
  auVar75._24_4_ = auVar61._24_4_ * 0.0;
  auVar75._28_4_ = 0;
  auVar61 = vpminsd_avx2(auVar67,auVar79);
  auVar59 = vpminsd_avx2(auVar68,auVar78);
  auVar61 = vmaxps_avx(auVar61,auVar59);
  auVar59 = vpminsd_avx2(auVar69,auVar75);
  uVar93 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar66._4_4_ = uVar93;
  auVar66._0_4_ = uVar93;
  auVar66._8_4_ = uVar93;
  auVar66._12_4_ = uVar93;
  auVar66._16_4_ = uVar93;
  auVar66._20_4_ = uVar93;
  auVar66._24_4_ = uVar93;
  auVar66._28_4_ = uVar93;
  auVar59 = vmaxps_avx512vl(auVar59,auVar66);
  auVar61 = vmaxps_avx(auVar61,auVar59);
  auVar59._8_4_ = 0x3f7ffffa;
  auVar59._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar59._12_4_ = 0x3f7ffffa;
  auVar59._16_4_ = 0x3f7ffffa;
  auVar59._20_4_ = 0x3f7ffffa;
  auVar59._24_4_ = 0x3f7ffffa;
  auVar59._28_4_ = 0x3f7ffffa;
  local_98 = vmulps_avx512vl(auVar61,auVar59);
  auVar61 = vpmaxsd_avx2(auVar67,auVar79);
  auVar59 = vpmaxsd_avx2(auVar68,auVar78);
  auVar61 = vminps_avx(auVar61,auVar59);
  auVar59 = vpmaxsd_avx2(auVar69,auVar75);
  fVar204 = ray->tfar;
  auVar76._4_4_ = fVar204;
  auVar76._0_4_ = fVar204;
  auVar76._8_4_ = fVar204;
  auVar76._12_4_ = fVar204;
  auVar76._16_4_ = fVar204;
  auVar76._20_4_ = fVar204;
  auVar76._24_4_ = fVar204;
  auVar76._28_4_ = fVar204;
  auVar59 = vminps_avx512vl(auVar59,auVar76);
  auVar61 = vminps_avx(auVar61,auVar59);
  auVar77._8_4_ = 0x3f800003;
  auVar77._0_8_ = 0x3f8000033f800003;
  auVar77._12_4_ = 0x3f800003;
  auVar77._16_4_ = 0x3f800003;
  auVar77._20_4_ = 0x3f800003;
  auVar77._24_4_ = 0x3f800003;
  auVar77._28_4_ = 0x3f800003;
  auVar61 = vmulps_avx512vl(auVar61,auVar77);
  uVar10 = vpcmpgtd_avx512vl(auVar60,_DAT_01fe9900);
  uVar9 = vcmpps_avx512vl(local_98,auVar61,2);
  if ((byte)((byte)uVar9 & (byte)uVar10) == 0) {
    return false;
  }
  uVar32 = (ulong)(byte)((byte)uVar9 & (byte)uVar10);
  auVar74._16_16_ = auVar61._16_16_;
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar241 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar231 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar232 = ZEXT1664(auVar37);
  auVar240 = ZEXT464(0x3f800000);
LAB_01c9084c:
  lVar26 = 0;
  for (uVar24 = uVar32; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
    lVar26 = lVar26 + 1;
  }
  local_300 = (ulong)*(uint *)(prim + 2);
  local_250 = (ulong)*(uint *)(prim + lVar26 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[local_300].ptr;
  uVar24 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_250);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar37 = *(undefined1 (*) [16])(_Var8 + uVar24 * (long)pvVar7);
  auVar47 = *(undefined1 (*) [16])(_Var8 + (uVar24 + 1) * (long)pvVar7);
  auVar46 = *(undefined1 (*) [16])(_Var8 + (uVar24 + 2) * (long)pvVar7);
  auVar45 = *(undefined1 (*) [16])(_Var8 + (long)pvVar7 * (uVar24 + 3));
  lVar26 = *(long *)&pGVar5[1].time_range.upper;
  auVar44 = *(undefined1 (*) [16])(lVar26 + (long)p_Var6 * uVar24);
  auVar43 = *(undefined1 (*) [16])(lVar26 + (long)p_Var6 * (uVar24 + 1));
  auVar42 = *(undefined1 (*) [16])(lVar26 + (long)p_Var6 * (uVar24 + 2));
  uVar32 = uVar32 - 1 & uVar32;
  auVar41 = *(undefined1 (*) [16])(lVar26 + (long)p_Var6 * (uVar24 + 3));
  if (uVar32 != 0) {
    uVar30 = uVar32 - 1 & uVar32;
    for (uVar24 = uVar32; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
    }
    if (uVar30 != 0) {
      for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar63._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar38 = vmulps_avx512vl(auVar41,auVar63._0_16_);
  auVar39 = vfmadd231ps_avx512vl(auVar38,auVar42,auVar63._0_16_);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar43,auVar39);
  auVar51._0_4_ = auVar44._0_4_ + auVar38._0_4_;
  auVar51._4_4_ = auVar44._4_4_ + auVar38._4_4_;
  auVar51._8_4_ = auVar44._8_4_ + auVar38._8_4_;
  auVar51._12_4_ = auVar44._12_4_ + auVar38._12_4_;
  auVar50 = auVar241._0_16_;
  auVar38 = vfmadd231ps_avx512vl(auVar39,auVar43,auVar50);
  auVar39 = vfnmadd231ps_avx512vl(auVar38,auVar44,auVar50);
  auVar38 = vmulps_avx512vl(auVar45,auVar63._0_16_);
  auVar40 = vfmadd231ps_avx512vl(auVar38,auVar46,auVar63._0_16_);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar47,auVar40);
  auVar206._0_4_ = auVar37._0_4_ + auVar38._0_4_;
  auVar206._4_4_ = auVar37._4_4_ + auVar38._4_4_;
  auVar206._8_4_ = auVar37._8_4_ + auVar38._8_4_;
  auVar206._12_4_ = auVar37._12_4_ + auVar38._12_4_;
  auVar38 = vfmadd231ps_avx512vl(auVar40,auVar47,auVar50);
  auVar40 = vfnmadd231ps_avx512vl(auVar38,auVar37,auVar50);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar42,auVar41);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar43,auVar63._0_16_);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar44,auVar63._0_16_);
  auVar41 = vmulps_avx512vl(auVar41,auVar50);
  auVar42 = vfnmadd231ps_avx512vl(auVar41,auVar50,auVar42);
  auVar43 = vfmadd231ps_avx512vl(auVar42,auVar63._0_16_,auVar43);
  auVar42 = vfnmadd231ps_avx512vl(auVar43,auVar63._0_16_,auVar44);
  auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar46,auVar45);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar47,auVar63._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar37,auVar63._0_16_);
  auVar45 = vmulps_avx512vl(auVar45,auVar50);
  auVar46 = vfnmadd231ps_avx512vl(auVar45,auVar50,auVar46);
  auVar47 = vfmadd231ps_avx512vl(auVar46,auVar63._0_16_,auVar47);
  auVar43 = vfnmadd231ps_avx512vl(auVar47,auVar63._0_16_,auVar37);
  auVar37 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar47 = vshufps_avx(auVar206,auVar206,0xc9);
  fVar201 = auVar39._0_4_;
  auVar127._0_4_ = fVar201 * auVar47._0_4_;
  fVar202 = auVar39._4_4_;
  auVar127._4_4_ = fVar202 * auVar47._4_4_;
  fVar203 = auVar39._8_4_;
  auVar127._8_4_ = fVar203 * auVar47._8_4_;
  fVar98 = auVar39._12_4_;
  auVar127._12_4_ = fVar98 * auVar47._12_4_;
  auVar47 = vfmsub231ps_fma(auVar127,auVar37,auVar206);
  auVar46 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar47 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar128._0_4_ = fVar201 * auVar47._0_4_;
  auVar128._4_4_ = fVar202 * auVar47._4_4_;
  auVar128._8_4_ = fVar203 * auVar47._8_4_;
  auVar128._12_4_ = fVar98 * auVar47._12_4_;
  auVar37 = vfmsub231ps_fma(auVar128,auVar37,auVar40);
  auVar45 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar47 = vshufps_avx(auVar44,auVar44,0xc9);
  fVar109 = auVar42._0_4_;
  auVar119._0_4_ = fVar109 * auVar47._0_4_;
  fVar116 = auVar42._4_4_;
  auVar119._4_4_ = fVar116 * auVar47._4_4_;
  fVar117 = auVar42._8_4_;
  auVar119._8_4_ = fVar117 * auVar47._8_4_;
  fVar118 = auVar42._12_4_;
  auVar119._12_4_ = fVar118 * auVar47._12_4_;
  auVar47 = vfmsub231ps_fma(auVar119,auVar37,auVar44);
  auVar44 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar47 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar158._0_4_ = auVar47._0_4_ * fVar109;
  auVar158._4_4_ = auVar47._4_4_ * fVar116;
  auVar158._8_4_ = auVar47._8_4_ * fVar117;
  auVar158._12_4_ = auVar47._12_4_ * fVar118;
  auVar37 = vfmsub231ps_fma(auVar158,auVar37,auVar43);
  auVar43 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vdpps_avx(auVar46,auVar46,0x7f);
  fVar204 = auVar37._0_4_;
  auVar63._16_16_ = auVar74._16_16_;
  auVar62._4_28_ = auVar63._4_28_;
  auVar62._0_4_ = fVar204;
  auVar47 = vrsqrt14ss_avx512f(auVar63._0_16_,auVar62._0_16_);
  fVar92 = auVar47._0_4_;
  fVar197 = fVar92 * 1.5 - fVar204 * 0.5 * fVar92 * fVar92 * fVar92;
  auVar47 = vdpps_avx(auVar46,auVar45,0x7f);
  fVar205 = fVar197 * auVar46._0_4_;
  fVar213 = fVar197 * auVar46._4_4_;
  fVar214 = fVar197 * auVar46._8_4_;
  fVar215 = fVar197 * auVar46._12_4_;
  auVar166._0_4_ = auVar45._0_4_ * fVar204;
  auVar166._4_4_ = auVar45._4_4_ * fVar204;
  auVar166._8_4_ = auVar45._8_4_ * fVar204;
  auVar166._12_4_ = auVar45._12_4_ * fVar204;
  fVar204 = auVar47._0_4_;
  auVar141._0_4_ = fVar204 * auVar46._0_4_;
  auVar141._4_4_ = fVar204 * auVar46._4_4_;
  auVar141._8_4_ = fVar204 * auVar46._8_4_;
  auVar141._12_4_ = fVar204 * auVar46._12_4_;
  auVar46 = vsubps_avx(auVar166,auVar141);
  auVar47 = vrcp14ss_avx512f(auVar63._0_16_,auVar62._0_16_);
  auVar37 = vfnmadd213ss_avx512f(auVar37,auVar47,ZEXT416(0x40000000));
  fVar204 = auVar47._0_4_ * auVar37._0_4_;
  auVar37 = vdpps_avx(auVar44,auVar44,0x7f);
  fVar92 = auVar37._0_4_;
  auVar65._16_16_ = auVar74._16_16_;
  auVar65._0_16_ = auVar63._0_16_;
  auVar64._4_28_ = auVar65._4_28_;
  auVar64._0_4_ = fVar92;
  auVar47 = vrsqrt14ss_avx512f(auVar63._0_16_,auVar64._0_16_);
  fVar199 = auVar47._0_4_;
  fVar199 = fVar199 * 1.5 - fVar92 * 0.5 * fVar199 * fVar199 * fVar199;
  auVar47 = vdpps_avx(auVar44,auVar43,0x7f);
  fVar185 = fVar199 * auVar44._0_4_;
  fVar196 = fVar199 * auVar44._4_4_;
  fVar198 = fVar199 * auVar44._8_4_;
  fVar200 = fVar199 * auVar44._12_4_;
  auVar129._0_4_ = fVar92 * auVar43._0_4_;
  auVar129._4_4_ = fVar92 * auVar43._4_4_;
  auVar129._8_4_ = fVar92 * auVar43._8_4_;
  auVar129._12_4_ = fVar92 * auVar43._12_4_;
  fVar92 = auVar47._0_4_;
  auVar120._0_4_ = fVar92 * auVar44._0_4_;
  auVar120._4_4_ = fVar92 * auVar44._4_4_;
  auVar120._8_4_ = fVar92 * auVar44._8_4_;
  auVar120._12_4_ = fVar92 * auVar44._12_4_;
  auVar45 = vsubps_avx(auVar129,auVar120);
  auVar47 = vrcp14ss_avx512f(auVar63._0_16_,auVar64._0_16_);
  auVar37 = vfnmadd213ss_avx512f(auVar37,auVar47,ZEXT416(0x40000000));
  fVar92 = auVar47._0_4_ * auVar37._0_4_;
  auVar37 = vshufps_avx(auVar51,auVar51,0xff);
  auVar148._0_4_ = fVar205 * auVar37._0_4_;
  auVar148._4_4_ = fVar213 * auVar37._4_4_;
  auVar148._8_4_ = fVar214 * auVar37._8_4_;
  auVar148._12_4_ = fVar215 * auVar37._12_4_;
  local_1a8 = vsubps_avx(auVar51,auVar148);
  auVar47 = vshufps_avx(auVar39,auVar39,0xff);
  auVar130._0_4_ = auVar47._0_4_ * fVar205 + auVar37._0_4_ * fVar197 * auVar46._0_4_ * fVar204;
  auVar130._4_4_ = auVar47._4_4_ * fVar213 + auVar37._4_4_ * fVar197 * auVar46._4_4_ * fVar204;
  auVar130._8_4_ = auVar47._8_4_ * fVar214 + auVar37._8_4_ * fVar197 * auVar46._8_4_ * fVar204;
  auVar130._12_4_ = auVar47._12_4_ * fVar215 + auVar37._12_4_ * fVar197 * auVar46._12_4_ * fVar204;
  auVar46 = vsubps_avx(auVar39,auVar130);
  local_1b8._0_4_ = auVar51._0_4_ + auVar148._0_4_;
  local_1b8._4_4_ = auVar51._4_4_ + auVar148._4_4_;
  fStack_1b0 = auVar51._8_4_ + auVar148._8_4_;
  fStack_1ac = auVar51._12_4_ + auVar148._12_4_;
  auVar37 = vshufps_avx(auVar38,auVar38,0xff);
  auVar131._0_4_ = fVar185 * auVar37._0_4_;
  auVar131._4_4_ = fVar196 * auVar37._4_4_;
  auVar131._8_4_ = fVar198 * auVar37._8_4_;
  auVar131._12_4_ = fVar200 * auVar37._12_4_;
  local_1c8 = vsubps_avx(auVar38,auVar131);
  auVar47 = vshufps_avx(auVar42,auVar42,0xff);
  auVar52._0_4_ = fVar185 * auVar47._0_4_ + auVar37._0_4_ * fVar199 * auVar45._0_4_ * fVar92;
  auVar52._4_4_ = fVar196 * auVar47._4_4_ + auVar37._4_4_ * fVar199 * auVar45._4_4_ * fVar92;
  auVar52._8_4_ = fVar198 * auVar47._8_4_ + auVar37._8_4_ * fVar199 * auVar45._8_4_ * fVar92;
  auVar52._12_4_ = fVar200 * auVar47._12_4_ + auVar37._12_4_ * fVar199 * auVar45._12_4_ * fVar92;
  auVar37 = vsubps_avx(auVar42,auVar52);
  _local_1d8 = vaddps_avx512vl(auVar38,auVar131);
  auVar49._0_4_ = auVar46._0_4_ * 0.33333334;
  auVar49._4_4_ = auVar46._4_4_ * 0.33333334;
  auVar49._8_4_ = auVar46._8_4_ * 0.33333334;
  auVar49._12_4_ = auVar46._12_4_ * 0.33333334;
  local_1e8 = vaddps_avx512vl(local_1a8,auVar49);
  auVar54._0_4_ = auVar37._0_4_ * 0.33333334;
  auVar54._4_4_ = auVar37._4_4_ * 0.33333334;
  auVar54._8_4_ = auVar37._8_4_ * 0.33333334;
  auVar54._12_4_ = auVar37._12_4_ * 0.33333334;
  local_1f8 = vsubps_avx512vl(local_1c8,auVar54);
  auVar40._0_4_ = (fVar201 + auVar130._0_4_) * 0.33333334;
  auVar40._4_4_ = (fVar202 + auVar130._4_4_) * 0.33333334;
  auVar40._8_4_ = (fVar203 + auVar130._8_4_) * 0.33333334;
  auVar40._12_4_ = (fVar98 + auVar130._12_4_) * 0.33333334;
  _local_208 = vaddps_avx512vl(_local_1b8,auVar40);
  auVar50._0_4_ = (fVar109 + auVar52._0_4_) * 0.33333334;
  auVar50._4_4_ = (fVar116 + auVar52._4_4_) * 0.33333334;
  auVar50._8_4_ = (fVar117 + auVar52._8_4_) * 0.33333334;
  auVar50._12_4_ = (fVar118 + auVar52._12_4_) * 0.33333334;
  _local_218 = vsubps_avx512vl(_local_1d8,auVar50);
  aVar1 = (ray->org).field_0;
  auVar47 = vsubps_avx(local_1a8,(undefined1  [16])aVar1);
  uVar93 = auVar47._0_4_;
  auVar99._4_4_ = uVar93;
  auVar99._0_4_ = uVar93;
  auVar99._8_4_ = uVar93;
  auVar99._12_4_ = uVar93;
  auVar37 = vshufps_avx(auVar47,auVar47,0x55);
  auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
  aVar2 = (pre->ray_space).vx.field_0;
  aVar3 = (pre->ray_space).vy.field_0;
  fVar204 = (pre->ray_space).vz.field_0.m128[0];
  fVar92 = (pre->ray_space).vz.field_0.m128[1];
  fVar197 = (pre->ray_space).vz.field_0.m128[2];
  fVar199 = (pre->ray_space).vz.field_0.m128[3];
  auVar53._0_4_ = fVar204 * auVar47._0_4_;
  auVar53._4_4_ = fVar92 * auVar47._4_4_;
  auVar53._8_4_ = fVar197 * auVar47._8_4_;
  auVar53._12_4_ = fVar199 * auVar47._12_4_;
  auVar37 = vfmadd231ps_fma(auVar53,(undefined1  [16])aVar3,auVar37);
  auVar44 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar99);
  auVar47 = vsubps_avx512vl(local_1e8,(undefined1  [16])aVar1);
  uVar93 = auVar47._0_4_;
  auVar55._4_4_ = uVar93;
  auVar55._0_4_ = uVar93;
  auVar55._8_4_ = uVar93;
  auVar55._12_4_ = uVar93;
  auVar37 = vshufps_avx(auVar47,auVar47,0x55);
  auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
  auVar48._0_4_ = fVar204 * auVar47._0_4_;
  auVar48._4_4_ = fVar92 * auVar47._4_4_;
  auVar48._8_4_ = fVar197 * auVar47._8_4_;
  auVar48._12_4_ = fVar199 * auVar47._12_4_;
  auVar37 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar3,auVar37);
  auVar43 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar55);
  auVar47 = vsubps_avx512vl(local_1f8,(undefined1  [16])aVar1);
  uVar93 = auVar47._0_4_;
  auVar149._4_4_ = uVar93;
  auVar149._0_4_ = uVar93;
  auVar149._8_4_ = uVar93;
  auVar149._12_4_ = uVar93;
  auVar37 = vshufps_avx(auVar47,auVar47,0x55);
  auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
  auVar101._0_4_ = fVar204 * auVar47._0_4_;
  auVar101._4_4_ = fVar92 * auVar47._4_4_;
  auVar101._8_4_ = fVar197 * auVar47._8_4_;
  auVar101._12_4_ = fVar199 * auVar47._12_4_;
  auVar37 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar3,auVar37);
  auVar42 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar149);
  auVar47 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
  uVar93 = auVar47._0_4_;
  auVar159._4_4_ = uVar93;
  auVar159._0_4_ = uVar93;
  auVar159._8_4_ = uVar93;
  auVar159._12_4_ = uVar93;
  auVar37 = vshufps_avx(auVar47,auVar47,0x55);
  auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
  auVar150._0_4_ = fVar204 * auVar47._0_4_;
  auVar150._4_4_ = fVar92 * auVar47._4_4_;
  auVar150._8_4_ = fVar197 * auVar47._8_4_;
  auVar150._12_4_ = fVar199 * auVar47._12_4_;
  auVar37 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar3,auVar37);
  auVar41 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar159);
  auVar47 = vsubps_avx(_local_1b8,(undefined1  [16])aVar1);
  uVar93 = auVar47._0_4_;
  auVar167._4_4_ = uVar93;
  auVar167._0_4_ = uVar93;
  auVar167._8_4_ = uVar93;
  auVar167._12_4_ = uVar93;
  auVar37 = vshufps_avx(auVar47,auVar47,0x55);
  auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
  auVar160._0_4_ = auVar47._0_4_ * fVar204;
  auVar160._4_4_ = auVar47._4_4_ * fVar92;
  auVar160._8_4_ = auVar47._8_4_ * fVar197;
  auVar160._12_4_ = auVar47._12_4_ * fVar199;
  auVar37 = vfmadd231ps_fma(auVar160,(undefined1  [16])aVar3,auVar37);
  auVar38 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar167);
  auVar47 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar1);
  uVar93 = auVar47._0_4_;
  auVar178._4_4_ = uVar93;
  auVar178._0_4_ = uVar93;
  auVar178._8_4_ = uVar93;
  auVar178._12_4_ = uVar93;
  auVar37 = vshufps_avx(auVar47,auVar47,0x55);
  auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
  auVar168._0_4_ = auVar47._0_4_ * fVar204;
  auVar168._4_4_ = auVar47._4_4_ * fVar92;
  auVar168._8_4_ = auVar47._8_4_ * fVar197;
  auVar168._12_4_ = auVar47._12_4_ * fVar199;
  auVar37 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar3,auVar37);
  auVar74._16_16_ = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar178);
  auVar47 = vsubps_avx512vl(_local_218,(undefined1  [16])aVar1);
  uVar93 = auVar47._0_4_;
  auVar186._4_4_ = uVar93;
  auVar186._0_4_ = uVar93;
  auVar186._8_4_ = uVar93;
  auVar186._12_4_ = uVar93;
  auVar37 = vshufps_avx(auVar47,auVar47,0x55);
  auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
  auVar179._0_4_ = auVar47._0_4_ * fVar204;
  auVar179._4_4_ = auVar47._4_4_ * fVar92;
  auVar179._8_4_ = auVar47._8_4_ * fVar197;
  auVar179._12_4_ = auVar47._12_4_ * fVar199;
  auVar37 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar3,auVar37);
  auVar39 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar186);
  auVar47 = vsubps_avx512vl(_local_1d8,(undefined1  [16])aVar1);
  uVar93 = auVar47._0_4_;
  auVar187._4_4_ = uVar93;
  auVar187._0_4_ = uVar93;
  auVar187._8_4_ = uVar93;
  auVar187._12_4_ = uVar93;
  auVar37 = vshufps_avx(auVar47,auVar47,0x55);
  auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
  auVar121._0_4_ = fVar204 * auVar47._0_4_;
  auVar121._4_4_ = fVar92 * auVar47._4_4_;
  auVar121._8_4_ = fVar197 * auVar47._8_4_;
  auVar121._12_4_ = fVar199 * auVar47._12_4_;
  auVar37 = vfmadd231ps_fma(auVar121,(undefined1  [16])aVar3,auVar37);
  auVar40 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar187);
  local_2f8 = vmovlhps_avx512f(auVar44,auVar38);
  auVar239 = ZEXT1664(local_2f8);
  local_318 = vmovlhps_avx512f(auVar43,auVar74._16_16_);
  auVar237 = ZEXT1664(local_318);
  local_268 = vmovlhps_avx(auVar42,auVar39);
  _local_188 = vmovlhps_avx512f(auVar41,auVar40);
  auVar37 = vminps_avx512vl(local_2f8,local_318);
  auVar46 = vmaxps_avx512vl(local_2f8,local_318);
  auVar47 = vminps_avx512vl(local_268,_local_188);
  auVar47 = vminps_avx(auVar37,auVar47);
  auVar37 = vmaxps_avx512vl(local_268,_local_188);
  auVar37 = vmaxps_avx(auVar46,auVar37);
  auVar46 = vshufpd_avx(auVar47,auVar47,3);
  auVar45 = vshufpd_avx(auVar37,auVar37,3);
  auVar47 = vminps_avx(auVar47,auVar46);
  auVar37 = vmaxps_avx(auVar37,auVar45);
  auVar47 = vandps_avx512vl(auVar47,auVar231._0_16_);
  auVar37 = vandps_avx512vl(auVar37,auVar231._0_16_);
  auVar37 = vmaxps_avx(auVar47,auVar37);
  auVar47 = vmovshdup_avx(auVar37);
  auVar37 = vmaxss_avx(auVar47,auVar37);
  local_278._8_8_ = auVar44._0_8_;
  local_278._0_8_ = auVar44._0_8_;
  local_288 = vmovddup_avx512vl(auVar43);
  local_298 = vmovddup_avx512vl(auVar42);
  local_2a8._0_8_ = auVar41._0_8_;
  local_2a8._8_8_ = local_2a8._0_8_;
  register0x00001348 = auVar38._0_8_;
  local_2b8 = auVar38._0_8_;
  register0x00001388 = auVar74._16_8_;
  local_2c8 = auVar74._16_8_;
  register0x00001408 = auVar39._0_8_;
  local_2d8 = auVar39._0_8_;
  register0x00001448 = auVar40._0_8_;
  local_2e8 = auVar40._0_8_;
  local_198 = ZEXT416((uint)(auVar37._0_4_ * 9.536743e-07));
  local_d8 = vbroadcastss_avx512vl(local_198);
  auVar37 = vxorps_avx512vl(local_d8._0_16_,auVar232._0_16_);
  local_78 = auVar37._0_4_;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  uStack_68 = local_78;
  uStack_64 = local_78;
  uStack_60 = local_78;
  uStack_5c = local_78;
  local_328 = vsubps_avx512vl(local_318,local_2f8);
  local_e8 = vsubps_avx512vl(local_268,local_318);
  local_f8 = vsubps_avx512vl(_local_188,local_268);
  local_108 = vsubps_avx(_local_1b8,local_1a8);
  local_118 = vsubps_avx512vl(_local_208,local_1e8);
  local_128 = vsubps_avx512vl(_local_218,local_1f8);
  _local_138 = vsubps_avx512vl(_local_1d8,local_1c8);
  bVar29 = false;
  auVar37 = ZEXT816(0x3f80000000000000);
  uVar24 = 0;
  auVar39 = auVar37;
LAB_01c90eff:
  do {
    auVar47 = vshufps_avx(auVar39,auVar39,0x50);
    auVar221._8_4_ = 0x3f800000;
    auVar221._0_8_ = 0x3f8000003f800000;
    auVar221._12_4_ = 0x3f800000;
    auVar224._16_4_ = 0x3f800000;
    auVar224._0_16_ = auVar221;
    auVar224._20_4_ = 0x3f800000;
    auVar224._24_4_ = 0x3f800000;
    auVar224._28_4_ = 0x3f800000;
    auVar46 = vsubps_avx(auVar221,auVar47);
    fVar204 = auVar47._0_4_;
    auVar122._0_4_ = local_2b8._0_4_ * fVar204;
    fVar92 = auVar47._4_4_;
    auVar122._4_4_ = local_2b8._4_4_ * fVar92;
    fVar197 = auVar47._8_4_;
    auVar122._8_4_ = local_2b8._8_4_ * fVar197;
    fVar199 = auVar47._12_4_;
    auVar122._12_4_ = local_2b8._12_4_ * fVar199;
    auVar132._0_4_ = local_2c8._0_4_ * fVar204;
    auVar132._4_4_ = local_2c8._4_4_ * fVar92;
    auVar132._8_4_ = local_2c8._8_4_ * fVar197;
    auVar132._12_4_ = local_2c8._12_4_ * fVar199;
    auVar142._0_4_ = local_2d8._0_4_ * fVar204;
    auVar142._4_4_ = local_2d8._4_4_ * fVar92;
    auVar142._8_4_ = local_2d8._8_4_ * fVar197;
    auVar142._12_4_ = local_2d8._12_4_ * fVar199;
    auVar102._0_4_ = local_2e8._0_4_ * fVar204;
    auVar102._4_4_ = local_2e8._4_4_ * fVar92;
    auVar102._8_4_ = local_2e8._8_4_ * fVar197;
    auVar102._12_4_ = local_2e8._12_4_ * fVar199;
    auVar45 = vfmadd231ps_fma(auVar122,auVar46,local_278);
    auVar44 = vfmadd231ps_avx512vl(auVar132,auVar46,local_288);
    auVar43 = vfmadd231ps_avx512vl(auVar142,auVar46,local_298);
    auVar46 = vfmadd231ps_fma(auVar102,local_2a8,auVar46);
    auVar47 = vmovshdup_avx(auVar37);
    fVar92 = auVar37._0_4_;
    fVar204 = (auVar47._0_4_ - fVar92) * 0.04761905;
    auVar165._4_4_ = fVar92;
    auVar165._0_4_ = fVar92;
    auVar165._8_4_ = fVar92;
    auVar165._12_4_ = fVar92;
    auVar165._16_4_ = fVar92;
    auVar165._20_4_ = fVar92;
    auVar165._24_4_ = fVar92;
    auVar165._28_4_ = fVar92;
    auVar114._0_8_ = auVar47._0_8_;
    auVar114._8_8_ = auVar114._0_8_;
    auVar114._16_8_ = auVar114._0_8_;
    auVar114._24_8_ = auVar114._0_8_;
    auVar61 = vsubps_avx(auVar114,auVar165);
    uVar93 = auVar45._0_4_;
    auVar115._4_4_ = uVar93;
    auVar115._0_4_ = uVar93;
    auVar115._8_4_ = uVar93;
    auVar115._12_4_ = uVar93;
    auVar115._16_4_ = uVar93;
    auVar115._20_4_ = uVar93;
    auVar115._24_4_ = uVar93;
    auVar115._28_4_ = uVar93;
    auVar182._8_4_ = 1;
    auVar182._0_8_ = 0x100000001;
    auVar182._12_4_ = 1;
    auVar182._16_4_ = 1;
    auVar182._20_4_ = 1;
    auVar182._24_4_ = 1;
    auVar182._28_4_ = 1;
    auVar76 = ZEXT1632(auVar45);
    auVar59 = vpermps_avx2(auVar182,auVar76);
    auVar66 = vbroadcastss_avx512vl(auVar44);
    auVar77 = ZEXT1632(auVar44);
    auVar60 = vpermps_avx512vl(auVar182,auVar77);
    auVar67 = vbroadcastss_avx512vl(auVar43);
    auVar74 = ZEXT1632(auVar43);
    auVar68 = vpermps_avx512vl(auVar182,auVar74);
    auVar69 = vbroadcastss_avx512vl(auVar46);
    auVar73 = ZEXT1632(auVar46);
    auVar70 = vpermps_avx512vl(auVar182,auVar73);
    auVar183._4_4_ = fVar204;
    auVar183._0_4_ = fVar204;
    auVar183._8_4_ = fVar204;
    auVar183._12_4_ = fVar204;
    auVar183._16_4_ = fVar204;
    auVar183._20_4_ = fVar204;
    auVar183._24_4_ = fVar204;
    auVar183._28_4_ = fVar204;
    auVar58 = vbroadcastss_avx512vl(ZEXT416(2));
    auVar71 = vpermps_avx512vl(auVar58,auVar76);
    auVar157._8_4_ = 3;
    auVar157._0_8_ = 0x300000003;
    auVar157._12_4_ = 3;
    auVar157._16_4_ = 3;
    auVar157._20_4_ = 3;
    auVar157._24_4_ = 3;
    auVar157._28_4_ = 3;
    auVar72 = vpermps_avx512vl(auVar157,auVar76);
    auVar56 = vpermps_avx512vl(auVar58,auVar77);
    auVar76 = vpermps_avx2(auVar157,auVar77);
    auVar57 = vpermps_avx512vl(auVar58,auVar74);
    auVar77 = vpermps_avx2(auVar157,auVar74);
    auVar58 = vpermps_avx512vl(auVar58,auVar73);
    auVar73 = vpermps_avx512vl(auVar157,auVar73);
    auVar47 = vfmadd132ps_fma(auVar61,auVar165,_DAT_01faff20);
    auVar61 = vsubps_avx(auVar224,ZEXT1632(auVar47));
    auVar74 = vmulps_avx512vl(auVar66,ZEXT1632(auVar47));
    auVar78 = ZEXT1632(auVar47);
    auVar75 = vmulps_avx512vl(auVar60,auVar78);
    auVar46 = vfmadd231ps_fma(auVar74,auVar61,auVar115);
    auVar45 = vfmadd231ps_fma(auVar75,auVar61,auVar59);
    auVar74 = vmulps_avx512vl(auVar67,auVar78);
    auVar75 = vmulps_avx512vl(auVar68,auVar78);
    auVar66 = vfmadd231ps_avx512vl(auVar74,auVar61,auVar66);
    auVar60 = vfmadd231ps_avx512vl(auVar75,auVar61,auVar60);
    auVar74 = vmulps_avx512vl(auVar69,auVar78);
    auVar75 = ZEXT1632(auVar47);
    auVar70 = vmulps_avx512vl(auVar70,auVar75);
    auVar67 = vfmadd231ps_avx512vl(auVar74,auVar61,auVar67);
    auVar68 = vfmadd231ps_avx512vl(auVar70,auVar61,auVar68);
    fVar197 = auVar47._0_4_;
    fVar199 = auVar47._4_4_;
    auVar15._4_4_ = fVar199 * auVar66._4_4_;
    auVar15._0_4_ = fVar197 * auVar66._0_4_;
    fVar201 = auVar47._8_4_;
    auVar15._8_4_ = fVar201 * auVar66._8_4_;
    fVar202 = auVar47._12_4_;
    auVar15._12_4_ = fVar202 * auVar66._12_4_;
    auVar15._16_4_ = auVar66._16_4_ * 0.0;
    auVar15._20_4_ = auVar66._20_4_ * 0.0;
    auVar15._24_4_ = auVar66._24_4_ * 0.0;
    auVar15._28_4_ = fVar92;
    auVar16._4_4_ = fVar199 * auVar60._4_4_;
    auVar16._0_4_ = fVar197 * auVar60._0_4_;
    auVar16._8_4_ = fVar201 * auVar60._8_4_;
    auVar16._12_4_ = fVar202 * auVar60._12_4_;
    auVar16._16_4_ = auVar60._16_4_ * 0.0;
    auVar16._20_4_ = auVar60._20_4_ * 0.0;
    auVar16._24_4_ = auVar60._24_4_ * 0.0;
    auVar16._28_4_ = auVar59._28_4_;
    auVar46 = vfmadd231ps_fma(auVar15,auVar61,ZEXT1632(auVar46));
    auVar45 = vfmadd231ps_fma(auVar16,auVar61,ZEXT1632(auVar45));
    auVar107._0_4_ = fVar197 * auVar67._0_4_;
    auVar107._4_4_ = fVar199 * auVar67._4_4_;
    auVar107._8_4_ = fVar201 * auVar67._8_4_;
    auVar107._12_4_ = fVar202 * auVar67._12_4_;
    auVar107._16_4_ = auVar67._16_4_ * 0.0;
    auVar107._20_4_ = auVar67._20_4_ * 0.0;
    auVar107._24_4_ = auVar67._24_4_ * 0.0;
    auVar107._28_4_ = 0;
    auVar17._4_4_ = fVar199 * auVar68._4_4_;
    auVar17._0_4_ = fVar197 * auVar68._0_4_;
    auVar17._8_4_ = fVar201 * auVar68._8_4_;
    auVar17._12_4_ = fVar202 * auVar68._12_4_;
    auVar17._16_4_ = auVar68._16_4_ * 0.0;
    auVar17._20_4_ = auVar68._20_4_ * 0.0;
    auVar17._24_4_ = auVar68._24_4_ * 0.0;
    auVar17._28_4_ = auVar67._28_4_;
    auVar44 = vfmadd231ps_fma(auVar107,auVar61,auVar66);
    auVar43 = vfmadd231ps_fma(auVar17,auVar61,auVar60);
    auVar18._28_4_ = auVar60._28_4_;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(fVar202 * auVar43._12_4_,
                            CONCAT48(fVar201 * auVar43._8_4_,
                                     CONCAT44(fVar199 * auVar43._4_4_,fVar197 * auVar43._0_4_))));
    auVar42 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar202 * auVar44._12_4_,
                                                 CONCAT48(fVar201 * auVar44._8_4_,
                                                          CONCAT44(fVar199 * auVar44._4_4_,
                                                                   fVar197 * auVar44._0_4_)))),
                              auVar61,ZEXT1632(auVar46));
    auVar41 = vfmadd231ps_fma(auVar18,auVar61,ZEXT1632(auVar45));
    auVar59 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar46));
    auVar66 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar45));
    auVar60 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar59 = vmulps_avx512vl(auVar59,auVar60);
    auVar66 = vmulps_avx512vl(auVar66,auVar60);
    auVar177._0_4_ = fVar204 * auVar59._0_4_;
    auVar177._4_4_ = fVar204 * auVar59._4_4_;
    auVar177._8_4_ = fVar204 * auVar59._8_4_;
    auVar177._12_4_ = fVar204 * auVar59._12_4_;
    auVar177._16_4_ = fVar204 * auVar59._16_4_;
    auVar177._20_4_ = fVar204 * auVar59._20_4_;
    auVar177._24_4_ = fVar204 * auVar59._24_4_;
    auVar177._28_4_ = 0;
    auVar59 = vmulps_avx512vl(auVar183,auVar66);
    auVar45 = vxorps_avx512vl(auVar69._0_16_,auVar69._0_16_);
    auVar66 = vpermt2ps_avx512vl(ZEXT1632(auVar42),_DAT_01feed00,ZEXT1632(auVar45));
    auVar67 = vpermt2ps_avx512vl(ZEXT1632(auVar41),_DAT_01feed00,ZEXT1632(auVar45));
    auVar108._0_4_ = auVar177._0_4_ + auVar42._0_4_;
    auVar108._4_4_ = auVar177._4_4_ + auVar42._4_4_;
    auVar108._8_4_ = auVar177._8_4_ + auVar42._8_4_;
    auVar108._12_4_ = auVar177._12_4_ + auVar42._12_4_;
    auVar108._16_4_ = auVar177._16_4_ + 0.0;
    auVar108._20_4_ = auVar177._20_4_ + 0.0;
    auVar108._24_4_ = auVar177._24_4_ + 0.0;
    auVar108._28_4_ = 0;
    auVar78 = ZEXT1632(auVar45);
    auVar68 = vpermt2ps_avx512vl(auVar177,_DAT_01feed00,auVar78);
    auVar69 = vaddps_avx512vl(ZEXT1632(auVar41),auVar59);
    auVar70 = vpermt2ps_avx512vl(auVar59,_DAT_01feed00,auVar78);
    auVar59 = vsubps_avx(auVar66,auVar68);
    auVar68 = vsubps_avx512vl(auVar67,auVar70);
    auVar70 = vmulps_avx512vl(auVar56,auVar75);
    auVar74 = vmulps_avx512vl(auVar76,auVar75);
    auVar70 = vfmadd231ps_avx512vl(auVar70,auVar61,auVar71);
    auVar71 = vfmadd231ps_avx512vl(auVar74,auVar61,auVar72);
    auVar72 = vmulps_avx512vl(auVar57,auVar75);
    auVar74 = vmulps_avx512vl(auVar77,auVar75);
    auVar72 = vfmadd231ps_avx512vl(auVar72,auVar61,auVar56);
    auVar76 = vfmadd231ps_avx512vl(auVar74,auVar61,auVar76);
    auVar58 = vmulps_avx512vl(auVar58,auVar75);
    auVar56 = vmulps_avx512vl(auVar73,auVar75);
    auVar46 = vfmadd231ps_fma(auVar58,auVar61,auVar57);
    auVar58 = vfmadd231ps_avx512vl(auVar56,auVar61,auVar77);
    auVar56 = vmulps_avx512vl(auVar75,auVar72);
    auVar73 = ZEXT1632(auVar47);
    auVar57 = vmulps_avx512vl(auVar73,auVar76);
    auVar70 = vfmadd231ps_avx512vl(auVar56,auVar61,auVar70);
    auVar71 = vfmadd231ps_avx512vl(auVar57,auVar61,auVar71);
    auVar58 = vmulps_avx512vl(auVar73,auVar58);
    auVar72 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar202 * auVar46._12_4_,
                                            CONCAT48(fVar201 * auVar46._8_4_,
                                                     CONCAT44(fVar199 * auVar46._4_4_,
                                                              fVar197 * auVar46._0_4_)))),auVar61,
                         auVar72);
    auVar76 = vfmadd231ps_avx512vl(auVar58,auVar61,auVar76);
    auVar19._4_4_ = fVar199 * auVar72._4_4_;
    auVar19._0_4_ = fVar197 * auVar72._0_4_;
    auVar19._8_4_ = fVar201 * auVar72._8_4_;
    auVar19._12_4_ = fVar202 * auVar72._12_4_;
    auVar19._16_4_ = auVar72._16_4_ * 0.0;
    auVar19._20_4_ = auVar72._20_4_ * 0.0;
    auVar19._24_4_ = auVar72._24_4_ * 0.0;
    auVar19._28_4_ = auVar77._28_4_;
    auVar77 = vmulps_avx512vl(auVar73,auVar76);
    auVar58 = vfmadd231ps_avx512vl(auVar19,auVar61,auVar70);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar71,auVar61);
    auVar61 = vsubps_avx512vl(auVar72,auVar70);
    auVar76 = vsubps_avx512vl(auVar76,auVar71);
    auVar61 = vmulps_avx512vl(auVar61,auVar60);
    auVar76 = vmulps_avx512vl(auVar76,auVar60);
    fVar92 = fVar204 * auVar61._0_4_;
    fVar197 = fVar204 * auVar61._4_4_;
    auVar20._4_4_ = fVar197;
    auVar20._0_4_ = fVar92;
    fVar199 = fVar204 * auVar61._8_4_;
    auVar20._8_4_ = fVar199;
    fVar201 = fVar204 * auVar61._12_4_;
    auVar20._12_4_ = fVar201;
    fVar202 = fVar204 * auVar61._16_4_;
    auVar20._16_4_ = fVar202;
    fVar203 = fVar204 * auVar61._20_4_;
    auVar20._20_4_ = fVar203;
    fVar204 = fVar204 * auVar61._24_4_;
    auVar20._24_4_ = fVar204;
    auVar20._28_4_ = auVar61._28_4_;
    auVar76 = vmulps_avx512vl(auVar183,auVar76);
    auVar60 = vpermt2ps_avx512vl(auVar58,_DAT_01feed00,auVar78);
    auVar70 = vpermt2ps_avx512vl(auVar77,_DAT_01feed00,auVar78);
    auVar184._0_4_ = auVar58._0_4_ + fVar92;
    auVar184._4_4_ = auVar58._4_4_ + fVar197;
    auVar184._8_4_ = auVar58._8_4_ + fVar199;
    auVar184._12_4_ = auVar58._12_4_ + fVar201;
    auVar184._16_4_ = auVar58._16_4_ + fVar202;
    auVar184._20_4_ = auVar58._20_4_ + fVar203;
    auVar184._24_4_ = auVar58._24_4_ + fVar204;
    auVar184._28_4_ = auVar58._28_4_ + auVar61._28_4_;
    auVar61 = vpermt2ps_avx512vl(auVar20,_DAT_01feed00,ZEXT1632(auVar45));
    auVar71 = vaddps_avx512vl(auVar77,auVar76);
    auVar76 = vpermt2ps_avx512vl(auVar76,_DAT_01feed00,ZEXT1632(auVar45));
    auVar61 = vsubps_avx(auVar60,auVar61);
    auVar76 = vsubps_avx512vl(auVar70,auVar76);
    in_ZMM17 = ZEXT3264(auVar76);
    auVar125 = ZEXT1632(auVar42);
    auVar72 = vsubps_avx512vl(auVar58,auVar125);
    auVar138 = ZEXT1632(auVar41);
    auVar56 = vsubps_avx512vl(auVar77,auVar138);
    auVar57 = vsubps_avx512vl(auVar60,auVar66);
    auVar72 = vaddps_avx512vl(auVar72,auVar57);
    auVar57 = vsubps_avx512vl(auVar70,auVar67);
    auVar56 = vaddps_avx512vl(auVar56,auVar57);
    auVar57 = vmulps_avx512vl(auVar138,auVar72);
    auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar125,auVar56);
    auVar73 = vmulps_avx512vl(auVar69,auVar72);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar108,auVar56);
    auVar74 = vmulps_avx512vl(auVar68,auVar72);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar59,auVar56);
    auVar75 = vmulps_avx512vl(auVar67,auVar72);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar66,auVar56);
    auVar78 = vmulps_avx512vl(auVar77,auVar72);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar58,auVar56);
    auVar79 = vmulps_avx512vl(auVar71,auVar72);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar184,auVar56);
    auVar80 = vmulps_avx512vl(auVar76,auVar72);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar61,auVar56);
    auVar72 = vmulps_avx512vl(auVar70,auVar72);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar60,auVar56);
    auVar56 = vminps_avx512vl(auVar57,auVar73);
    auVar57 = vmaxps_avx512vl(auVar57,auVar73);
    auVar73 = vminps_avx512vl(auVar74,auVar75);
    auVar56 = vminps_avx512vl(auVar56,auVar73);
    auVar73 = vmaxps_avx512vl(auVar74,auVar75);
    auVar57 = vmaxps_avx512vl(auVar57,auVar73);
    auVar73 = vminps_avx512vl(auVar78,auVar79);
    auVar74 = vmaxps_avx512vl(auVar78,auVar79);
    auVar75 = vminps_avx512vl(auVar80,auVar72);
    auVar73 = vminps_avx512vl(auVar73,auVar75);
    auVar56 = vminps_avx512vl(auVar56,auVar73);
    auVar72 = vmaxps_avx512vl(auVar80,auVar72);
    auVar72 = vmaxps_avx512vl(auVar74,auVar72);
    auVar72 = vmaxps_avx512vl(auVar57,auVar72);
    uVar9 = vcmpps_avx512vl(auVar56,local_d8,2);
    auVar21._4_4_ = uStack_74;
    auVar21._0_4_ = local_78;
    auVar21._8_4_ = uStack_70;
    auVar21._12_4_ = uStack_6c;
    auVar21._16_4_ = uStack_68;
    auVar21._20_4_ = uStack_64;
    auVar21._24_4_ = uStack_60;
    auVar21._28_4_ = uStack_5c;
    uVar10 = vcmpps_avx512vl(auVar72,auVar21,5);
    bVar22 = (byte)uVar9 & (byte)uVar10 & 0x7f;
    if (bVar22 != 0) {
      auVar72 = vsubps_avx512vl(auVar66,auVar125);
      auVar56 = vsubps_avx512vl(auVar67,auVar138);
      auVar57 = vsubps_avx512vl(auVar60,auVar58);
      auVar72 = vaddps_avx512vl(auVar72,auVar57);
      auVar57 = vsubps_avx512vl(auVar70,auVar77);
      auVar56 = vaddps_avx512vl(auVar56,auVar57);
      auVar57 = vmulps_avx512vl(auVar138,auVar72);
      auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar56,auVar125);
      auVar69 = vmulps_avx512vl(auVar69,auVar72);
      auVar69 = vfnmadd213ps_avx512vl(auVar108,auVar56,auVar69);
      auVar68 = vmulps_avx512vl(auVar68,auVar72);
      auVar68 = vfnmadd213ps_avx512vl(auVar59,auVar56,auVar68);
      auVar59 = vmulps_avx512vl(auVar67,auVar72);
      auVar67 = vfnmadd231ps_avx512vl(auVar59,auVar56,auVar66);
      auVar59 = vmulps_avx512vl(auVar77,auVar72);
      auVar77 = vfnmadd231ps_avx512vl(auVar59,auVar56,auVar58);
      auVar59 = vmulps_avx512vl(auVar71,auVar72);
      auVar58 = vfnmadd213ps_avx512vl(auVar184,auVar56,auVar59);
      auVar59 = vmulps_avx512vl(auVar76,auVar72);
      auVar71 = vfnmadd213ps_avx512vl(auVar61,auVar56,auVar59);
      auVar61 = vmulps_avx512vl(auVar70,auVar72);
      auVar60 = vfnmadd231ps_avx512vl(auVar61,auVar60,auVar56);
      auVar59 = vminps_avx(auVar57,auVar69);
      auVar61 = vmaxps_avx(auVar57,auVar69);
      auVar66 = vminps_avx(auVar68,auVar67);
      auVar66 = vminps_avx(auVar59,auVar66);
      auVar59 = vmaxps_avx(auVar68,auVar67);
      auVar61 = vmaxps_avx(auVar61,auVar59);
      auVar76 = vminps_avx(auVar77,auVar58);
      auVar59 = vmaxps_avx(auVar77,auVar58);
      auVar77 = vminps_avx(auVar71,auVar60);
      auVar76 = vminps_avx(auVar76,auVar77);
      auVar76 = vminps_avx(auVar66,auVar76);
      auVar66 = vmaxps_avx(auVar71,auVar60);
      auVar59 = vmaxps_avx(auVar59,auVar66);
      auVar61 = vmaxps_avx(auVar61,auVar59);
      uVar9 = vcmpps_avx512vl(auVar61,auVar21,5);
      uVar10 = vcmpps_avx512vl(auVar76,local_d8,2);
      bVar22 = bVar22 & (byte)uVar9 & (byte)uVar10;
      if (bVar22 != 0) {
        auStack_178[uVar24] = (uint)bVar22;
        uVar9 = vmovlps_avx(auVar37);
        (&uStack_b8)[uVar24] = uVar9;
        uVar30 = vmovlps_avx(auVar39);
        auStack_58[uVar24] = uVar30;
        uVar24 = (ulong)((int)uVar24 + 1);
      }
    }
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar231 = ZEXT1664(auVar37);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar232 = ZEXT1664(auVar37);
    auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar233 = ZEXT3264(auVar61);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar234 = ZEXT1664(auVar37);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar235 = ZEXT1664(auVar37);
    auVar236 = ZEXT3264(_DAT_01feed20);
    auVar74._16_16_ = DAT_01feed20._16_16_;
    auVar238 = ZEXT1664(local_328);
LAB_01c91409:
    do {
      do {
        do {
          auVar47 = auVar241._0_16_;
          if ((int)uVar24 == 0) {
            if (bVar29) {
              return bVar29;
            }
            fVar204 = ray->tfar;
            auVar14._4_4_ = fVar204;
            auVar14._0_4_ = fVar204;
            auVar14._8_4_ = fVar204;
            auVar14._12_4_ = fVar204;
            auVar14._16_4_ = fVar204;
            auVar14._20_4_ = fVar204;
            auVar14._24_4_ = fVar204;
            auVar14._28_4_ = fVar204;
            uVar9 = vcmpps_avx512vl(local_98,auVar14,2);
            uVar31 = (uint)uVar32 & (uint)uVar9;
            uVar32 = (ulong)uVar31;
            if (uVar31 == 0) {
              return bVar29;
            }
            goto LAB_01c9084c;
          }
          uVar23 = (int)uVar24 - 1;
          uVar25 = (ulong)uVar23;
          uVar31 = auStack_178[uVar25];
          auVar39._8_8_ = 0;
          auVar39._0_8_ = auStack_58[uVar25];
          uVar30 = 0;
          for (uVar28 = (ulong)uVar31; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000)
          {
            uVar30 = uVar30 + 1;
          }
          uVar27 = uVar31 - 1 & uVar31;
          bVar35 = uVar27 == 0;
          auStack_178[uVar25] = uVar27;
          if (bVar35) {
            uVar24 = (ulong)uVar23;
          }
          auVar94._8_8_ = 0;
          auVar94._0_8_ = uVar30;
          auVar37 = vpunpcklqdq_avx(auVar94,ZEXT416((int)uVar30 + 1));
          auVar37 = vcvtqq2ps_avx512vl(auVar37);
          auVar37 = vmulps_avx512vl(auVar37,auVar234._0_16_);
          uVar93 = *(undefined4 *)((long)&uStack_b8 + uVar25 * 8 + 4);
          auVar11._4_4_ = uVar93;
          auVar11._0_4_ = uVar93;
          auVar11._8_4_ = uVar93;
          auVar11._12_4_ = uVar93;
          auVar46 = vmulps_avx512vl(auVar37,auVar11);
          auVar45 = auVar235._0_16_;
          auVar37 = vsubps_avx512vl(auVar45,auVar37);
          uVar93 = *(undefined4 *)(&uStack_b8 + uVar25);
          auVar12._4_4_ = uVar93;
          auVar12._0_4_ = uVar93;
          auVar12._8_4_ = uVar93;
          auVar12._12_4_ = uVar93;
          auVar37 = vfmadd231ps_avx512vl(auVar46,auVar37,auVar12);
          auVar46 = vmovshdup_avx(auVar37);
          fVar204 = auVar46._0_4_ - auVar37._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar204));
          if (uVar31 == 0 || bVar35) goto LAB_01c90eff;
          auVar46 = vshufps_avx(auVar39,auVar39,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar204));
          auVar42 = vsubps_avx512vl(auVar45,auVar46);
          fVar92 = auVar46._0_4_;
          auVar133._0_4_ = fVar92 * (float)local_2b8._0_4_;
          fVar197 = auVar46._4_4_;
          auVar133._4_4_ = fVar197 * (float)local_2b8._4_4_;
          fVar199 = auVar46._8_4_;
          auVar133._8_4_ = fVar199 * fStack_2b0;
          fVar201 = auVar46._12_4_;
          auVar133._12_4_ = fVar201 * fStack_2ac;
          auVar143._0_4_ = fVar92 * (float)local_2c8._0_4_;
          auVar143._4_4_ = fVar197 * (float)local_2c8._4_4_;
          auVar143._8_4_ = fVar199 * fStack_2c0;
          auVar143._12_4_ = fVar201 * fStack_2bc;
          auVar151._0_4_ = fVar92 * (float)local_2d8._0_4_;
          auVar151._4_4_ = fVar197 * (float)local_2d8._4_4_;
          auVar151._8_4_ = fVar199 * fStack_2d0;
          auVar151._12_4_ = fVar201 * fStack_2cc;
          auVar110._0_4_ = fVar92 * (float)local_2e8._0_4_;
          auVar110._4_4_ = fVar197 * (float)local_2e8._4_4_;
          auVar110._8_4_ = fVar199 * fStack_2e0;
          auVar110._12_4_ = fVar201 * fStack_2dc;
          auVar46 = vfmadd231ps_fma(auVar133,auVar42,local_278);
          auVar44 = vfmadd231ps_fma(auVar143,auVar42,local_288);
          auVar43 = vfmadd231ps_fma(auVar151,auVar42,local_298);
          auVar42 = vfmadd231ps_fma(auVar110,auVar42,local_2a8);
          auVar126._16_16_ = auVar46;
          auVar126._0_16_ = auVar46;
          auVar139._16_16_ = auVar44;
          auVar139._0_16_ = auVar44;
          auVar147._16_16_ = auVar43;
          auVar147._0_16_ = auVar43;
          auVar59 = vpermps_avx512vl(auVar236._0_32_,ZEXT1632(auVar37));
          auVar61 = vsubps_avx(auVar139,auVar126);
          auVar44 = vfmadd213ps_fma(auVar61,auVar59,auVar126);
          auVar61 = vsubps_avx(auVar147,auVar139);
          auVar41 = vfmadd213ps_fma(auVar61,auVar59,auVar139);
          auVar46 = vsubps_avx(auVar42,auVar43);
          auVar140._16_16_ = auVar46;
          auVar140._0_16_ = auVar46;
          auVar46 = vfmadd213ps_fma(auVar140,auVar59,auVar147);
          auVar61 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar44));
          auVar44 = vfmadd213ps_fma(auVar61,auVar59,ZEXT1632(auVar44));
          auVar61 = vsubps_avx(ZEXT1632(auVar46),ZEXT1632(auVar41));
          auVar46 = vfmadd213ps_fma(auVar61,auVar59,ZEXT1632(auVar41));
          auVar61 = vsubps_avx(ZEXT1632(auVar46),ZEXT1632(auVar44));
          auVar99 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar61,auVar59);
          auVar61 = vmulps_avx512vl(auVar61,auVar233._0_32_);
          auVar74._16_16_ = auVar61._16_16_;
          auVar46 = vmulss_avx512f(ZEXT416((uint)fVar204),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar92 = auVar46._0_4_;
          auVar152._0_8_ =
               CONCAT44(auVar99._4_4_ + fVar92 * auVar61._4_4_,
                        auVar99._0_4_ + fVar92 * auVar61._0_4_);
          auVar152._8_4_ = auVar99._8_4_ + fVar92 * auVar61._8_4_;
          auVar152._12_4_ = auVar99._12_4_ + fVar92 * auVar61._12_4_;
          auVar134._0_4_ = fVar92 * auVar61._16_4_;
          auVar134._4_4_ = fVar92 * auVar61._20_4_;
          auVar134._8_4_ = fVar92 * auVar61._24_4_;
          auVar134._12_4_ = fVar92 * auVar61._28_4_;
          auVar53 = vsubps_avx((undefined1  [16])0x0,auVar134);
          auVar41 = vshufpd_avx(auVar99,auVar99,3);
          auVar38 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar46 = vsubps_avx(auVar41,auVar99);
          auVar44 = vsubps_avx(auVar38,(undefined1  [16])0x0);
          auVar169._0_4_ = auVar46._0_4_ + auVar44._0_4_;
          auVar169._4_4_ = auVar46._4_4_ + auVar44._4_4_;
          auVar169._8_4_ = auVar46._8_4_ + auVar44._8_4_;
          auVar169._12_4_ = auVar46._12_4_ + auVar44._12_4_;
          auVar46 = vshufps_avx(auVar99,auVar99,0xb1);
          auVar44 = vshufps_avx(auVar152,auVar152,0xb1);
          auVar43 = vshufps_avx(auVar53,auVar53,0xb1);
          auVar42 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar222._4_4_ = auVar169._0_4_;
          auVar222._0_4_ = auVar169._0_4_;
          auVar222._8_4_ = auVar169._0_4_;
          auVar222._12_4_ = auVar169._0_4_;
          auVar40 = vshufps_avx(auVar169,auVar169,0x55);
          fVar92 = auVar40._0_4_;
          auVar180._0_4_ = auVar46._0_4_ * fVar92;
          fVar197 = auVar40._4_4_;
          auVar180._4_4_ = auVar46._4_4_ * fVar197;
          fVar199 = auVar40._8_4_;
          auVar180._8_4_ = auVar46._8_4_ * fVar199;
          fVar201 = auVar40._12_4_;
          auVar180._12_4_ = auVar46._12_4_ * fVar201;
          auVar188._0_4_ = auVar44._0_4_ * fVar92;
          auVar188._4_4_ = auVar44._4_4_ * fVar197;
          auVar188._8_4_ = auVar44._8_4_ * fVar199;
          auVar188._12_4_ = auVar44._12_4_ * fVar201;
          auVar207._0_4_ = auVar43._0_4_ * fVar92;
          auVar207._4_4_ = auVar43._4_4_ * fVar197;
          auVar207._8_4_ = auVar43._8_4_ * fVar199;
          auVar207._12_4_ = auVar43._12_4_ * fVar201;
          auVar170._0_4_ = auVar42._0_4_ * fVar92;
          auVar170._4_4_ = auVar42._4_4_ * fVar197;
          auVar170._8_4_ = auVar42._8_4_ * fVar199;
          auVar170._12_4_ = auVar42._12_4_ * fVar201;
          auVar46 = vfmadd231ps_fma(auVar180,auVar222,auVar99);
          auVar44 = vfmadd231ps_fma(auVar188,auVar222,auVar152);
          auVar51 = vfmadd231ps_fma(auVar207,auVar222,auVar53);
          auVar52 = vfmadd231ps_fma(auVar170,(undefined1  [16])0x0,auVar222);
          auVar40 = vshufpd_avx(auVar46,auVar46,1);
          auVar50 = vshufpd_avx(auVar44,auVar44,1);
          auVar48 = vshufpd_avx512vl(auVar51,auVar51,1);
          auVar49 = vshufpd_avx512vl(auVar52,auVar52,1);
          in_ZMM17 = ZEXT1664(auVar49);
          auVar43 = vminss_avx(auVar46,auVar44);
          auVar46 = vmaxss_avx(auVar44,auVar46);
          auVar42 = vminss_avx(auVar51,auVar52);
          auVar44 = vmaxss_avx(auVar52,auVar51);
          auVar43 = vminss_avx(auVar43,auVar42);
          auVar46 = vmaxss_avx(auVar44,auVar46);
          auVar42 = vminss_avx(auVar40,auVar50);
          auVar44 = vmaxss_avx(auVar50,auVar40);
          auVar40 = vminss_avx512f(auVar48,auVar49);
          auVar50 = vmaxss_avx512f(auVar49,auVar48);
          auVar44 = vmaxss_avx(auVar50,auVar44);
          auVar42 = vminss_avx512f(auVar42,auVar40);
          fVar197 = auVar44._0_4_;
          fVar92 = auVar46._0_4_;
          if (auVar43._0_4_ < 0.0001) {
            bVar36 = fVar197 == -0.0001;
            bVar33 = NAN(fVar197);
            if (fVar197 <= -0.0001) goto LAB_01c9163b;
            break;
          }
LAB_01c9163b:
          vucomiss_avx512f(auVar42);
          bVar36 = fVar197 <= -0.0001;
          bVar34 = -0.0001 < fVar92;
          bVar33 = bVar36;
          if (!bVar36) break;
          uVar9 = vcmpps_avx512vl(auVar43,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar10 = vcmpps_avx512vl(auVar42,SUB6416(ZEXT464(0x38d1b717),0),5);
          bVar22 = (byte)uVar9 & (byte)uVar10 & 1;
          bVar36 = bVar34 && bVar22 == 0;
          bVar33 = bVar34 && bVar22 == 0;
        } while (!bVar34 || bVar22 != 0);
        auVar51 = vxorps_avx512vl(auVar237._0_16_,auVar237._0_16_);
        vcmpss_avx512f(auVar43,auVar51,1);
        uVar9 = vcmpss_avx512f(auVar46,auVar51,1);
        bVar34 = (bool)((byte)uVar9 & 1);
        auVar74._0_16_ = auVar240._0_16_;
        auVar81._4_28_ = auVar74._4_28_;
        auVar81._0_4_ = (float)((uint)bVar34 * -0x40800000 + (uint)!bVar34 * auVar240._0_4_);
        vucomiss_avx512f(auVar81._0_16_);
        bVar33 = (bool)(!bVar36 | bVar33);
        bVar34 = bVar33 == false;
        auVar83._16_16_ = auVar74._16_16_;
        auVar83._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar82._4_28_ = auVar83._4_28_;
        auVar82._0_4_ = (uint)bVar33 * auVar51._0_4_ + (uint)!bVar33 * 0x7f800000;
        auVar50 = auVar82._0_16_;
        auVar85._16_16_ = auVar74._16_16_;
        auVar85._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar84._4_28_ = auVar85._4_28_;
        auVar84._0_4_ = (uint)bVar33 * auVar51._0_4_ + (uint)!bVar33 * -0x800000;
        auVar40 = auVar84._0_16_;
        auVar52 = vxorps_avx512vl(auVar239._0_16_,auVar239._0_16_);
        uVar9 = vcmpss_avx512f(auVar42,auVar51,1);
        bVar36 = (bool)((byte)uVar9 & 1);
        auVar87._16_16_ = auVar74._16_16_;
        auVar87._0_16_ = auVar240._0_16_;
        auVar86._4_28_ = auVar87._4_28_;
        auVar86._0_4_ = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * auVar240._0_4_);
        auVar51 = vucomiss_avx512f(auVar86._0_16_);
        in_ZMM17 = ZEXT1664(auVar51);
        if ((bVar33) || (bVar34)) {
          auVar42 = vucomiss_avx512f(auVar43);
          if ((bVar33) || (bVar34)) {
            auVar51 = vxorps_avx512vl(auVar43,auVar232._0_16_);
            in_ZMM17 = ZEXT1664(auVar51);
            auVar43 = vsubss_avx512f(auVar42,auVar43);
            auVar43 = vdivss_avx512f(auVar51,auVar43);
            auVar42 = vsubss_avx512f(ZEXT416(0x3f800000),auVar43);
            auVar42 = vfmadd213ss_avx512f(auVar42,auVar52,auVar43);
            auVar43 = auVar42;
          }
          else {
            auVar42 = vxorps_avx512vl(auVar42,auVar42);
            vucomiss_avx512f(auVar42);
            if ((bVar33) || (auVar43 = ZEXT416(0x3f800000), bVar34)) {
              auVar42 = ZEXT416(0x7f800000);
              auVar43 = SUB6416(ZEXT464(0xff800000),0);
            }
          }
          auVar50 = vminss_avx512f(auVar50,auVar42);
          auVar40 = vmaxss_avx(auVar43,auVar40);
        }
        auVar240 = ZEXT464(0x3f800000);
        auVar239 = ZEXT1664(local_2f8);
        auVar237 = ZEXT1664(local_318);
        auVar43 = vxorps_avx512vl(auVar42,auVar42);
        uVar9 = vcmpss_avx512f(auVar44,auVar43,1);
        bVar36 = (bool)((byte)uVar9 & 1);
        auVar44 = auVar240._0_16_;
        fVar199 = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * 0x3f800000);
        if ((auVar81._0_4_ != fVar199) || (NAN(auVar81._0_4_) || NAN(fVar199))) {
          if ((fVar197 != fVar92) || (NAN(fVar197) || NAN(fVar92))) {
            auVar46 = vxorps_avx512vl(auVar46,auVar232._0_16_);
            auVar171._0_4_ = auVar46._0_4_ / (fVar197 - fVar92);
            auVar171._4_12_ = auVar46._4_12_;
            auVar46 = vsubss_avx512f(auVar44,auVar171);
            auVar46 = vfmadd213ss_avx512f(auVar46,auVar43,auVar171);
            auVar42 = auVar46;
          }
          else if ((fVar92 != 0.0) ||
                  (auVar46 = auVar44, auVar42 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar92))) {
            auVar46 = SUB6416(ZEXT464(0xff800000),0);
            auVar42 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar50 = vminss_avx(auVar50,auVar42);
          auVar40 = vmaxss_avx(auVar46,auVar40);
        }
        bVar36 = auVar86._0_4_ != fVar199;
        auVar46 = vminss_avx512f(auVar50,auVar44);
        auVar89._16_16_ = auVar74._16_16_;
        auVar89._0_16_ = auVar50;
        auVar88._4_28_ = auVar89._4_28_;
        auVar88._0_4_ = (uint)bVar36 * auVar46._0_4_ + (uint)!bVar36 * auVar50._0_4_;
        auVar46 = vmaxss_avx512f(auVar44,auVar40);
        auVar91._16_16_ = auVar74._16_16_;
        auVar91._0_16_ = auVar40;
        auVar90._4_28_ = auVar91._4_28_;
        auVar90._0_4_ = (uint)bVar36 * auVar46._0_4_ + (uint)!bVar36 * auVar40._0_4_;
        auVar46 = vmaxss_avx512f(auVar43,auVar88._0_16_);
        auVar42 = vminss_avx512f(auVar90._0_16_,auVar44);
      } while (auVar42._0_4_ < auVar46._0_4_);
      auVar51 = vmaxss_avx512f(auVar43,ZEXT416((uint)(auVar46._0_4_ + -0.1)));
      auVar52 = vminss_avx512f(ZEXT416((uint)(auVar42._0_4_ + 0.1)),auVar44);
      auVar111._0_8_ = auVar99._0_8_;
      auVar111._8_8_ = auVar111._0_8_;
      auVar189._8_8_ = auVar152._0_8_;
      auVar189._0_8_ = auVar152._0_8_;
      auVar208._8_8_ = auVar53._0_8_;
      auVar208._0_8_ = auVar53._0_8_;
      auVar46 = vshufpd_avx(auVar152,auVar152,3);
      auVar43 = vshufpd_avx(auVar53,auVar53,3);
      auVar42 = vshufps_avx(auVar51,auVar52,0);
      auVar53 = vsubps_avx512vl(auVar45,auVar42);
      fVar92 = auVar42._0_4_;
      auVar144._0_4_ = fVar92 * auVar41._0_4_;
      fVar197 = auVar42._4_4_;
      auVar144._4_4_ = fVar197 * auVar41._4_4_;
      fVar199 = auVar42._8_4_;
      auVar144._8_4_ = fVar199 * auVar41._8_4_;
      fVar201 = auVar42._12_4_;
      auVar144._12_4_ = fVar201 * auVar41._12_4_;
      auVar153._0_4_ = fVar92 * auVar46._0_4_;
      auVar153._4_4_ = fVar197 * auVar46._4_4_;
      auVar153._8_4_ = fVar199 * auVar46._8_4_;
      auVar153._12_4_ = fVar201 * auVar46._12_4_;
      auVar225._0_4_ = auVar43._0_4_ * fVar92;
      auVar225._4_4_ = auVar43._4_4_ * fVar197;
      auVar225._8_4_ = auVar43._8_4_ * fVar199;
      auVar225._12_4_ = auVar43._12_4_ * fVar201;
      auVar135._0_4_ = fVar92 * auVar38._0_4_;
      auVar135._4_4_ = fVar197 * auVar38._4_4_;
      auVar135._8_4_ = fVar199 * auVar38._8_4_;
      auVar135._12_4_ = fVar201 * auVar38._12_4_;
      auVar38 = vfmadd231ps_fma(auVar144,auVar53,auVar111);
      auVar40 = vfmadd231ps_fma(auVar153,auVar53,auVar189);
      auVar50 = vfmadd231ps_fma(auVar225,auVar53,auVar208);
      auVar53 = vfmadd231ps_fma(auVar135,auVar53,ZEXT816(0));
      auVar43 = vsubss_avx512f(auVar44,auVar51);
      auVar46 = vmovshdup_avx(auVar39);
      auVar99 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * auVar51._0_4_)),auVar39,auVar43);
      auVar43 = vsubss_avx512f(auVar44,auVar52);
      auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * auVar52._0_4_)),auVar39,auVar43);
      auVar39 = vdivss_avx512f(auVar44,ZEXT416((uint)fVar204));
      auVar46 = vsubps_avx(auVar40,auVar38);
      auVar42 = vmulps_avx512vl(auVar46,auVar47);
      auVar46 = vsubps_avx(auVar50,auVar40);
      auVar41 = vmulps_avx512vl(auVar46,auVar47);
      auVar46 = vsubps_avx(auVar53,auVar50);
      auVar46 = vmulps_avx512vl(auVar46,auVar47);
      auVar43 = vminps_avx(auVar41,auVar46);
      auVar46 = vmaxps_avx(auVar41,auVar46);
      auVar43 = vminps_avx(auVar42,auVar43);
      auVar46 = vmaxps_avx(auVar42,auVar46);
      auVar42 = vshufpd_avx(auVar43,auVar43,3);
      auVar41 = vshufpd_avx(auVar46,auVar46,3);
      auVar43 = vminps_avx(auVar43,auVar42);
      auVar46 = vmaxps_avx(auVar46,auVar41);
      fVar204 = auVar39._0_4_;
      auVar172._0_4_ = auVar43._0_4_ * fVar204;
      auVar172._4_4_ = auVar43._4_4_ * fVar204;
      auVar172._8_4_ = auVar43._8_4_ * fVar204;
      auVar172._12_4_ = auVar43._12_4_ * fVar204;
      auVar161._0_4_ = fVar204 * auVar46._0_4_;
      auVar161._4_4_ = fVar204 * auVar46._4_4_;
      auVar161._8_4_ = fVar204 * auVar46._8_4_;
      auVar161._12_4_ = fVar204 * auVar46._12_4_;
      auVar51 = vdivss_avx512f(auVar44,ZEXT416((uint)(auVar48._0_4_ - auVar99._0_4_)));
      auVar46 = vshufpd_avx(auVar38,auVar38,3);
      auVar43 = vshufpd_avx(auVar40,auVar40,3);
      auVar42 = vshufpd_avx(auVar50,auVar50,3);
      auVar41 = vshufpd_avx(auVar53,auVar53,3);
      auVar46 = vsubps_avx(auVar46,auVar38);
      auVar38 = vsubps_avx(auVar43,auVar40);
      auVar39 = vsubps_avx(auVar42,auVar50);
      auVar41 = vsubps_avx(auVar41,auVar53);
      auVar43 = vminps_avx(auVar46,auVar38);
      auVar46 = vmaxps_avx(auVar46,auVar38);
      auVar42 = vminps_avx(auVar39,auVar41);
      auVar42 = vminps_avx(auVar43,auVar42);
      auVar43 = vmaxps_avx(auVar39,auVar41);
      auVar46 = vmaxps_avx(auVar46,auVar43);
      fVar204 = auVar51._0_4_;
      auVar209._0_4_ = fVar204 * auVar42._0_4_;
      auVar209._4_4_ = fVar204 * auVar42._4_4_;
      auVar209._8_4_ = fVar204 * auVar42._8_4_;
      auVar209._12_4_ = fVar204 * auVar42._12_4_;
      auVar190._0_4_ = fVar204 * auVar46._0_4_;
      auVar190._4_4_ = fVar204 * auVar46._4_4_;
      auVar190._8_4_ = fVar204 * auVar46._8_4_;
      auVar190._12_4_ = fVar204 * auVar46._12_4_;
      auVar41 = vinsertps_avx(auVar37,auVar99,0x10);
      auVar49 = vpermt2ps_avx512vl(auVar37,_DAT_01feecd0,auVar48);
      auVar100._0_4_ = auVar41._0_4_ + auVar49._0_4_;
      auVar100._4_4_ = auVar41._4_4_ + auVar49._4_4_;
      auVar100._8_4_ = auVar41._8_4_ + auVar49._8_4_;
      auVar100._12_4_ = auVar41._12_4_ + auVar49._12_4_;
      auVar13._8_4_ = 0x3f000000;
      auVar13._0_8_ = 0x3f0000003f000000;
      auVar13._12_4_ = 0x3f000000;
      auVar53 = vmulps_avx512vl(auVar100,auVar13);
      auVar43 = vshufps_avx(auVar53,auVar53,0x54);
      uVar93 = auVar53._0_4_;
      auVar103._4_4_ = uVar93;
      auVar103._0_4_ = uVar93;
      auVar103._8_4_ = uVar93;
      auVar103._12_4_ = uVar93;
      auVar38 = vfmadd213ps_avx512vl(auVar238._0_16_,auVar103,local_2f8);
      auVar39 = vfmadd213ps_avx512vl(local_e8,auVar103,local_318);
      auVar42 = vfmadd213ps_fma(local_f8,auVar103,local_268);
      auVar46 = vsubps_avx(auVar39,auVar38);
      auVar38 = vfmadd213ps_fma(auVar46,auVar103,auVar38);
      auVar46 = vsubps_avx(auVar42,auVar39);
      auVar46 = vfmadd213ps_fma(auVar46,auVar103,auVar39);
      auVar46 = vsubps_avx(auVar46,auVar38);
      auVar42 = vfmadd231ps_fma(auVar38,auVar46,auVar103);
      auVar40 = vmulps_avx512vl(auVar46,auVar47);
      auVar216._8_8_ = auVar42._0_8_;
      auVar216._0_8_ = auVar42._0_8_;
      auVar46 = vshufpd_avx(auVar42,auVar42,3);
      auVar42 = vshufps_avx(auVar53,auVar53,0x55);
      auVar38 = vsubps_avx(auVar46,auVar216);
      auVar39 = vfmadd231ps_fma(auVar216,auVar42,auVar38);
      auVar226._8_8_ = auVar40._0_8_;
      auVar226._0_8_ = auVar40._0_8_;
      auVar46 = vshufpd_avx(auVar40,auVar40,3);
      auVar46 = vsubps_avx512vl(auVar46,auVar226);
      auVar46 = vfmadd213ps_avx512vl(auVar46,auVar42,auVar226);
      auVar104._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
      auVar104._8_4_ = auVar38._8_4_ ^ 0x80000000;
      auVar104._12_4_ = auVar38._12_4_ ^ 0x80000000;
      auVar42 = vmovshdup_avx512vl(auVar46);
      auVar227._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
      auVar227._8_4_ = auVar42._8_4_ ^ 0x80000000;
      auVar227._12_4_ = auVar42._12_4_ ^ 0x80000000;
      auVar40 = vmovshdup_avx512vl(auVar38);
      auVar237 = ZEXT464(5);
      auVar50 = vpermt2ps_avx512vl(auVar227,ZEXT416(5),auVar38);
      auVar42 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar42._0_4_ * auVar38._0_4_)),auVar46,auVar40);
      auVar38 = vpermt2ps_avx512vl(auVar46,SUB6416(ZEXT464(4),0),auVar104);
      auVar136._0_4_ = auVar42._0_4_;
      auVar136._4_4_ = auVar136._0_4_;
      auVar136._8_4_ = auVar136._0_4_;
      auVar136._12_4_ = auVar136._0_4_;
      auVar46 = vdivps_avx(auVar50,auVar136);
      auVar54 = vdivps_avx512vl(auVar38,auVar136);
      fVar204 = auVar39._0_4_;
      auVar42 = vshufps_avx(auVar39,auVar39,0x55);
      auVar217._0_4_ = fVar204 * auVar46._0_4_ + auVar42._0_4_ * auVar54._0_4_;
      auVar217._4_4_ = fVar204 * auVar46._4_4_ + auVar42._4_4_ * auVar54._4_4_;
      auVar217._8_4_ = fVar204 * auVar46._8_4_ + auVar42._8_4_ * auVar54._8_4_;
      auVar217._12_4_ = fVar204 * auVar46._12_4_ + auVar42._12_4_ * auVar54._12_4_;
      auVar51 = vsubps_avx(auVar43,auVar217);
      auVar42 = vmovshdup_avx(auVar46);
      auVar43 = vinsertps_avx(auVar172,auVar209,0x1c);
      auVar228._0_4_ = auVar42._0_4_ * auVar43._0_4_;
      auVar228._4_4_ = auVar42._4_4_ * auVar43._4_4_;
      auVar228._8_4_ = auVar42._8_4_ * auVar43._8_4_;
      auVar228._12_4_ = auVar42._12_4_ * auVar43._12_4_;
      auVar52 = vinsertps_avx512f(auVar161,auVar190,0x1c);
      auVar42 = vmulps_avx512vl(auVar42,auVar52);
      auVar50 = vminps_avx512vl(auVar228,auVar42);
      auVar39 = vmaxps_avx(auVar42,auVar228);
      auVar40 = vmovshdup_avx(auVar54);
      auVar42 = vinsertps_avx(auVar209,auVar172,0x4c);
      auVar210._0_4_ = auVar40._0_4_ * auVar42._0_4_;
      auVar210._4_4_ = auVar40._4_4_ * auVar42._4_4_;
      auVar210._8_4_ = auVar40._8_4_ * auVar42._8_4_;
      auVar210._12_4_ = auVar40._12_4_ * auVar42._12_4_;
      auVar38 = vinsertps_avx(auVar190,auVar161,0x4c);
      auVar191._0_4_ = auVar40._0_4_ * auVar38._0_4_;
      auVar191._4_4_ = auVar40._4_4_ * auVar38._4_4_;
      auVar191._8_4_ = auVar40._8_4_ * auVar38._8_4_;
      auVar191._12_4_ = auVar40._12_4_ * auVar38._12_4_;
      auVar40 = vminps_avx(auVar210,auVar191);
      auVar50 = vaddps_avx512vl(auVar50,auVar40);
      auVar40 = vmaxps_avx(auVar191,auVar210);
      auVar192._0_4_ = auVar39._0_4_ + auVar40._0_4_;
      auVar192._4_4_ = auVar39._4_4_ + auVar40._4_4_;
      auVar192._8_4_ = auVar39._8_4_ + auVar40._8_4_;
      auVar192._12_4_ = auVar39._12_4_ + auVar40._12_4_;
      auVar211._8_8_ = 0x3f80000000000000;
      auVar211._0_8_ = 0x3f80000000000000;
      auVar39 = vsubps_avx(auVar211,auVar192);
      auVar40 = vsubps_avx(auVar211,auVar50);
      auVar50 = vsubps_avx(auVar41,auVar53);
      auVar53 = vsubps_avx(auVar49,auVar53);
      fVar201 = auVar50._0_4_;
      auVar229._0_4_ = fVar201 * auVar39._0_4_;
      fVar202 = auVar50._4_4_;
      auVar229._4_4_ = fVar202 * auVar39._4_4_;
      fVar203 = auVar50._8_4_;
      auVar229._8_4_ = fVar203 * auVar39._8_4_;
      fVar98 = auVar50._12_4_;
      auVar229._12_4_ = fVar98 * auVar39._12_4_;
      auVar55 = vbroadcastss_avx512vl(auVar46);
      auVar43 = vmulps_avx512vl(auVar55,auVar43);
      auVar52 = vmulps_avx512vl(auVar55,auVar52);
      auVar55 = vminps_avx512vl(auVar43,auVar52);
      auVar52 = vmaxps_avx512vl(auVar52,auVar43);
      auVar43 = vbroadcastss_avx512vl(auVar54);
      auVar42 = vmulps_avx512vl(auVar43,auVar42);
      auVar43 = vmulps_avx512vl(auVar43,auVar38);
      auVar38 = vminps_avx512vl(auVar42,auVar43);
      auVar38 = vaddps_avx512vl(auVar55,auVar38);
      auVar50 = vmulps_avx512vl(auVar50,auVar40);
      in_ZMM17 = ZEXT1664(auVar50);
      fVar204 = auVar53._0_4_;
      auVar193._0_4_ = fVar204 * auVar39._0_4_;
      fVar92 = auVar53._4_4_;
      auVar193._4_4_ = fVar92 * auVar39._4_4_;
      fVar197 = auVar53._8_4_;
      auVar193._8_4_ = fVar197 * auVar39._8_4_;
      fVar199 = auVar53._12_4_;
      auVar193._12_4_ = fVar199 * auVar39._12_4_;
      auVar212._0_4_ = fVar204 * auVar40._0_4_;
      auVar212._4_4_ = fVar92 * auVar40._4_4_;
      auVar212._8_4_ = fVar197 * auVar40._8_4_;
      auVar212._12_4_ = fVar199 * auVar40._12_4_;
      auVar43 = vmaxps_avx(auVar43,auVar42);
      auVar162._0_4_ = auVar52._0_4_ + auVar43._0_4_;
      auVar162._4_4_ = auVar52._4_4_ + auVar43._4_4_;
      auVar162._8_4_ = auVar52._8_4_ + auVar43._8_4_;
      auVar162._12_4_ = auVar52._12_4_ + auVar43._12_4_;
      auVar173._8_8_ = 0x3f800000;
      auVar173._0_8_ = 0x3f800000;
      auVar43 = vsubps_avx(auVar173,auVar162);
      auVar42 = vsubps_avx512vl(auVar173,auVar38);
      auVar223._0_4_ = fVar201 * auVar43._0_4_;
      auVar223._4_4_ = fVar202 * auVar43._4_4_;
      auVar223._8_4_ = fVar203 * auVar43._8_4_;
      auVar223._12_4_ = fVar98 * auVar43._12_4_;
      auVar218._0_4_ = fVar201 * auVar42._0_4_;
      auVar218._4_4_ = fVar202 * auVar42._4_4_;
      auVar218._8_4_ = fVar203 * auVar42._8_4_;
      auVar218._12_4_ = fVar98 * auVar42._12_4_;
      auVar163._0_4_ = fVar204 * auVar43._0_4_;
      auVar163._4_4_ = fVar92 * auVar43._4_4_;
      auVar163._8_4_ = fVar197 * auVar43._8_4_;
      auVar163._12_4_ = fVar199 * auVar43._12_4_;
      auVar174._0_4_ = fVar204 * auVar42._0_4_;
      auVar174._4_4_ = fVar92 * auVar42._4_4_;
      auVar174._8_4_ = fVar197 * auVar42._8_4_;
      auVar174._12_4_ = fVar199 * auVar42._12_4_;
      auVar43 = vminps_avx(auVar223,auVar218);
      auVar42 = vminps_avx512vl(auVar163,auVar174);
      auVar38 = vminps_avx512vl(auVar43,auVar42);
      auVar43 = vmaxps_avx(auVar218,auVar223);
      auVar42 = vmaxps_avx(auVar174,auVar163);
      auVar42 = vmaxps_avx(auVar42,auVar43);
      auVar39 = vminps_avx512vl(auVar229,auVar50);
      auVar43 = vminps_avx(auVar193,auVar212);
      auVar43 = vminps_avx(auVar39,auVar43);
      auVar43 = vhaddps_avx(auVar38,auVar43);
      auVar39 = vmaxps_avx512vl(auVar50,auVar229);
      auVar38 = vmaxps_avx(auVar212,auVar193);
      auVar38 = vmaxps_avx(auVar38,auVar39);
      auVar42 = vhaddps_avx(auVar42,auVar38);
      auVar43 = vshufps_avx(auVar43,auVar43,0xe8);
      auVar42 = vshufps_avx(auVar42,auVar42,0xe8);
      auVar164._0_4_ = auVar43._0_4_ + auVar51._0_4_;
      auVar164._4_4_ = auVar43._4_4_ + auVar51._4_4_;
      auVar164._8_4_ = auVar43._8_4_ + auVar51._8_4_;
      auVar164._12_4_ = auVar43._12_4_ + auVar51._12_4_;
      auVar175._0_4_ = auVar42._0_4_ + auVar51._0_4_;
      auVar175._4_4_ = auVar42._4_4_ + auVar51._4_4_;
      auVar175._8_4_ = auVar42._8_4_ + auVar51._8_4_;
      auVar175._12_4_ = auVar42._12_4_ + auVar51._12_4_;
      auVar43 = vmaxps_avx(auVar41,auVar164);
      auVar42 = vminps_avx(auVar175,auVar49);
      uVar30 = vcmpps_avx512vl(auVar42,auVar43,1);
    } while ((uVar30 & 3) != 0);
    uVar30 = vcmpps_avx512vl(auVar175,auVar49,1);
    uVar9 = vcmpps_avx512vl(auVar37,auVar164,1);
    if (((ushort)uVar9 & (ushort)uVar30 & 1) == 0) {
      bVar22 = 0;
    }
    else {
      auVar43 = vmovshdup_avx(auVar164);
      bVar22 = auVar99._0_4_ < auVar43._0_4_ & (byte)(uVar30 >> 1) & 0x7f;
    }
    auVar237 = ZEXT1664(local_318);
    if (((3 < (uint)uVar24 || uVar31 != 0 && !bVar35) | bVar22) == 1) {
      lVar26 = 200;
      do {
        auVar37 = vsubss_avx512f(auVar44,auVar51);
        fVar197 = auVar37._0_4_;
        fVar204 = fVar197 * fVar197 * fVar197;
        fVar199 = auVar51._0_4_;
        fVar92 = fVar199 * 3.0 * fVar197 * fVar197;
        fVar197 = fVar197 * fVar199 * fVar199 * 3.0;
        auVar123._4_4_ = fVar204;
        auVar123._0_4_ = fVar204;
        auVar123._8_4_ = fVar204;
        auVar123._12_4_ = fVar204;
        auVar112._4_4_ = fVar92;
        auVar112._0_4_ = fVar92;
        auVar112._8_4_ = fVar92;
        auVar112._12_4_ = fVar92;
        auVar95._4_4_ = fVar197;
        auVar95._0_4_ = fVar197;
        auVar95._8_4_ = fVar197;
        auVar95._12_4_ = fVar197;
        fVar199 = fVar199 * fVar199 * fVar199;
        auVar145._0_4_ = (float)local_188._0_4_ * fVar199;
        auVar145._4_4_ = (float)local_188._4_4_ * fVar199;
        auVar145._8_4_ = fStack_180 * fVar199;
        auVar145._12_4_ = fStack_17c * fVar199;
        auVar37 = vfmadd231ps_fma(auVar145,local_268,auVar95);
        auVar37 = vfmadd231ps_avx512vl(auVar37,local_318,auVar112);
        auVar37 = vfmadd231ps_avx512vl(auVar37,local_2f8,auVar123);
        auVar96._8_8_ = auVar37._0_8_;
        auVar96._0_8_ = auVar37._0_8_;
        auVar37 = vshufpd_avx(auVar37,auVar37,3);
        auVar43 = vshufps_avx(auVar51,auVar51,0x55);
        auVar37 = vsubps_avx(auVar37,auVar96);
        auVar43 = vfmadd213ps_fma(auVar37,auVar43,auVar96);
        fVar204 = auVar43._0_4_;
        auVar37 = vshufps_avx(auVar43,auVar43,0x55);
        auVar97._0_4_ = auVar46._0_4_ * fVar204 + auVar54._0_4_ * auVar37._0_4_;
        auVar97._4_4_ = auVar46._4_4_ * fVar204 + auVar54._4_4_ * auVar37._4_4_;
        auVar97._8_4_ = auVar46._8_4_ * fVar204 + auVar54._8_4_ * auVar37._8_4_;
        auVar97._12_4_ = auVar46._12_4_ * fVar204 + auVar54._12_4_ * auVar37._12_4_;
        auVar51 = vsubps_avx(auVar51,auVar97);
        auVar37 = vandps_avx512vl(auVar43,auVar231._0_16_);
        auVar43 = vprolq_avx512vl(auVar37,0x20);
        auVar37 = vmaxss_avx(auVar43,auVar37);
        if (auVar37._0_4_ < (float)local_198._0_4_) {
          fVar204 = auVar51._0_4_;
          if (0.0 <= fVar204) {
            auVar37 = vucomiss_avx512f(auVar51);
            auVar240 = ZEXT1664(auVar37);
            if (0.0 <= fVar204) {
              auVar37 = vmovshdup_avx(auVar51);
              fVar92 = auVar37._0_4_;
              if (0.0 <= fVar92) {
                auVar46 = vucomiss_avx512f(auVar37);
                auVar240 = ZEXT1664(auVar46);
                if (0.0 <= fVar92) {
                  auVar44 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
                  auVar50 = vinsertps_avx(auVar44,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2])
                                          ,0x28);
                  aVar1 = (ray->org).field_0;
                  auVar44 = vsubps_avx(local_1a8,(undefined1  [16])aVar1);
                  auVar44 = vdpps_avx(auVar44,auVar50,0x7f);
                  auVar43 = vsubps_avx(local_1e8,(undefined1  [16])aVar1);
                  auVar43 = vdpps_avx(auVar43,auVar50,0x7f);
                  auVar42 = vsubps_avx(local_1f8,(undefined1  [16])aVar1);
                  auVar42 = vdpps_avx(auVar42,auVar50,0x7f);
                  auVar41 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
                  auVar41 = vdpps_avx(auVar41,auVar50,0x7f);
                  auVar38 = vsubps_avx(_local_1b8,(undefined1  [16])aVar1);
                  auVar38 = vdpps_avx(auVar38,auVar50,0x7f);
                  auVar39 = vsubps_avx(_local_208,(undefined1  [16])aVar1);
                  auVar39 = vdpps_avx(auVar39,auVar50,0x7f);
                  auVar40 = vsubps_avx(_local_218,(undefined1  [16])aVar1);
                  auVar40 = vdpps_avx(auVar40,auVar50,0x7f);
                  auVar53 = vsubps_avx(_local_1d8,(undefined1  [16])aVar1);
                  auVar50 = vdpps_avx(auVar53,auVar50,0x7f);
                  auVar53 = vsubss_avx512f(auVar46,auVar37);
                  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ * fVar92)),auVar53,auVar44)
                  ;
                  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar39._0_4_ * fVar92)),auVar53,auVar43)
                  ;
                  auVar43 = vfmadd231ss_fma(ZEXT416((uint)(auVar40._0_4_ * fVar92)),auVar53,auVar42)
                  ;
                  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar92 * auVar50._0_4_)),auVar53,auVar41)
                  ;
                  auVar46 = vsubss_avx512f(auVar46,auVar51);
                  auVar146._0_4_ = auVar46._0_4_;
                  fVar92 = auVar146._0_4_ * auVar146._0_4_ * auVar146._0_4_;
                  fVar197 = fVar204 * 3.0 * auVar146._0_4_ * auVar146._0_4_;
                  fVar199 = auVar146._0_4_ * fVar204 * fVar204 * 3.0;
                  fVar202 = fVar204 * fVar204 * fVar204;
                  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * auVar42._0_4_)),
                                            ZEXT416((uint)fVar199),auVar43);
                  auVar46 = vfmadd231ss_fma(auVar46,ZEXT416((uint)fVar197),auVar44);
                  auVar37 = vfmadd231ss_fma(auVar46,ZEXT416((uint)fVar92),auVar37);
                  fVar201 = auVar37._0_4_;
                  if (((ray->org).field_0.m128[3] <= fVar201) &&
                     (fVar203 = ray->tfar, fVar201 <= fVar203)) {
                    auVar37 = vshufps_avx(auVar51,auVar51,0x55);
                    auVar44 = vsubps_avx512vl(auVar45,auVar37);
                    fVar98 = auVar37._0_4_;
                    auVar176._0_4_ = fVar98 * (float)local_1b8._0_4_;
                    fVar109 = auVar37._4_4_;
                    auVar176._4_4_ = fVar109 * (float)local_1b8._4_4_;
                    fVar116 = auVar37._8_4_;
                    auVar176._8_4_ = fVar116 * fStack_1b0;
                    fVar117 = auVar37._12_4_;
                    auVar176._12_4_ = fVar117 * fStack_1ac;
                    auVar181._0_4_ = fVar98 * (float)local_208._0_4_;
                    auVar181._4_4_ = fVar109 * (float)local_208._4_4_;
                    auVar181._8_4_ = fVar116 * fStack_200;
                    auVar181._12_4_ = fVar117 * fStack_1fc;
                    auVar194._0_4_ = fVar98 * (float)local_218._0_4_;
                    auVar194._4_4_ = fVar109 * (float)local_218._4_4_;
                    auVar194._8_4_ = fVar116 * fStack_210;
                    auVar194._12_4_ = fVar117 * fStack_20c;
                    auVar154._0_4_ = fVar98 * (float)local_1d8._0_4_;
                    auVar154._4_4_ = fVar109 * (float)local_1d8._4_4_;
                    auVar154._8_4_ = fVar116 * fStack_1d0;
                    auVar154._12_4_ = fVar117 * fStack_1cc;
                    auVar37 = vfmadd231ps_fma(auVar176,auVar44,local_1a8);
                    auVar46 = vfmadd231ps_fma(auVar181,auVar44,local_1e8);
                    auVar45 = vfmadd231ps_fma(auVar194,auVar44,local_1f8);
                    auVar44 = vfmadd231ps_fma(auVar154,auVar44,local_1c8);
                    auVar37 = vsubps_avx(auVar46,auVar37);
                    auVar46 = vsubps_avx(auVar45,auVar46);
                    auVar45 = vsubps_avx(auVar44,auVar45);
                    auVar195._0_4_ = fVar204 * auVar46._0_4_;
                    auVar195._4_4_ = fVar204 * auVar46._4_4_;
                    auVar195._8_4_ = fVar204 * auVar46._8_4_;
                    auVar195._12_4_ = fVar204 * auVar46._12_4_;
                    auVar146._4_4_ = auVar146._0_4_;
                    auVar146._8_4_ = auVar146._0_4_;
                    auVar146._12_4_ = auVar146._0_4_;
                    auVar37 = vfmadd231ps_fma(auVar195,auVar146,auVar37);
                    auVar155._0_4_ = fVar204 * auVar45._0_4_;
                    auVar155._4_4_ = fVar204 * auVar45._4_4_;
                    auVar155._8_4_ = fVar204 * auVar45._8_4_;
                    auVar155._12_4_ = fVar204 * auVar45._12_4_;
                    auVar46 = vfmadd231ps_fma(auVar155,auVar146,auVar46);
                    auVar156._0_4_ = fVar204 * auVar46._0_4_;
                    auVar156._4_4_ = fVar204 * auVar46._4_4_;
                    auVar156._8_4_ = fVar204 * auVar46._8_4_;
                    auVar156._12_4_ = fVar204 * auVar46._12_4_;
                    auVar37 = vfmadd231ps_fma(auVar156,auVar146,auVar37);
                    auVar37 = vmulps_avx512vl(auVar37,auVar47);
                    pGVar5 = (context->scene->geometries).items[local_300].ptr;
                    if ((pGVar5->mask & ray->mask) == 0) {
LAB_01c92228:
                      bVar22 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar22 = 1, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar137._0_4_ = fVar202 * (float)local_138._0_4_;
                      auVar137._4_4_ = fVar202 * (float)local_138._4_4_;
                      auVar137._8_4_ = fVar202 * fStack_130;
                      auVar137._12_4_ = fVar202 * fStack_12c;
                      auVar124._4_4_ = fVar199;
                      auVar124._0_4_ = fVar199;
                      auVar124._8_4_ = fVar199;
                      auVar124._12_4_ = fVar199;
                      auVar47 = vfmadd132ps_fma(auVar124,auVar137,local_128);
                      auVar113._4_4_ = fVar197;
                      auVar113._0_4_ = fVar197;
                      auVar113._8_4_ = fVar197;
                      auVar113._12_4_ = fVar197;
                      auVar47 = vfmadd132ps_fma(auVar113,auVar47,local_118);
                      auVar105._4_4_ = fVar92;
                      auVar105._0_4_ = fVar92;
                      auVar105._8_4_ = fVar92;
                      auVar105._12_4_ = fVar92;
                      auVar45 = vfmadd132ps_fma(auVar105,auVar47,local_108);
                      auVar47 = vshufps_avx(auVar45,auVar45,0xc9);
                      auVar46 = vshufps_avx(auVar37,auVar37,0xc9);
                      auVar106._0_4_ = auVar45._0_4_ * auVar46._0_4_;
                      auVar106._4_4_ = auVar45._4_4_ * auVar46._4_4_;
                      auVar106._8_4_ = auVar45._8_4_ * auVar46._8_4_;
                      auVar106._12_4_ = auVar45._12_4_ * auVar46._12_4_;
                      auVar47 = vfmsub231ps_fma(auVar106,auVar37,auVar47);
                      auVar37 = vshufps_avx(auVar47,auVar47,0xe9);
                      local_168 = vmovlps_avx(auVar37);
                      local_160 = auVar47._0_4_;
                      local_15c = vmovlps_avx(auVar51);
                      local_154 = (int)local_250;
                      local_150 = (int)local_300;
                      local_14c = context->user->instID[0];
                      local_148 = context->user->instPrimID[0];
                      ray->tfar = fVar201;
                      local_32c = -1;
                      local_248.valid = &local_32c;
                      local_248.geometryUserPtr = pGVar5->userPtr;
                      local_248.context = context->user;
                      local_248.hit = (RTCHitN *)&local_168;
                      local_248.N = 1;
                      local_248.ray = (RTCRayN *)ray;
                      if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar5->occlusionFilterN)(&local_248);
                        auVar238 = ZEXT1664(local_328);
                        auVar240 = ZEXT464(0x3f800000);
                        auVar236 = ZEXT3264(_DAT_01feed20);
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar235 = ZEXT1664(auVar37);
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar234 = ZEXT1664(auVar37);
                        auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar233 = ZEXT3264(auVar61);
                        auVar74._16_16_ = auVar61._16_16_;
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar232 = ZEXT1664(auVar37);
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar231 = ZEXT1664(auVar37);
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar241 = ZEXT1664(auVar37);
                        if (*local_248.valid != 0) goto LAB_01c9215e;
LAB_01c9221c:
                        auVar240 = ZEXT464(0x3f800000);
                        ray->tfar = fVar203;
                        goto LAB_01c92228;
                      }
LAB_01c9215e:
                      p_Var6 = context->args->filter;
                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var6)(&local_248);
                        auVar238 = ZEXT1664(local_328);
                        auVar240 = ZEXT464(0x3f800000);
                        auVar236 = ZEXT3264(_DAT_01feed20);
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar235 = ZEXT1664(auVar37);
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar234 = ZEXT1664(auVar37);
                        auVar61 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar233 = ZEXT3264(auVar61);
                        auVar74._16_16_ = auVar61._16_16_;
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar232 = ZEXT1664(auVar37);
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar231 = ZEXT1664(auVar37);
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar241 = ZEXT1664(auVar37);
                        if (*local_248.valid == 0) goto LAB_01c9221c;
                      }
                      bVar22 = 1;
                    }
                    bVar29 = (bool)(bVar29 | bVar22);
                  }
                }
              }
            }
          }
          break;
        }
        lVar26 = lVar26 + -1;
      } while (lVar26 != 0);
      goto LAB_01c91409;
    }
    auVar39 = vinsertps_avx(auVar99,auVar48,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }